

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(int *rowVals,int *colPtrs,int *indx,int *consP)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  int k_1;
  long lVar46;
  double *pdVar47;
  double *pdVar48;
  int iVar49;
  double *pdVar50;
  double *pdVar51;
  long lVar52;
  double *pdVar53;
  int iVar54;
  double *pdVar55;
  double *pdVar56;
  int l;
  double *pdVar57;
  double *__s;
  int k;
  double *pdVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  undefined1 auVar111 [16];
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  undefined4 uVar191;
  undefined4 uVar192;
  undefined4 uVar193;
  undefined4 uVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  undefined4 uVar259;
  undefined4 uVar260;
  undefined4 uVar261;
  undefined4 uVar262;
  undefined4 uVar263;
  undefined4 uVar264;
  undefined4 uVar265;
  undefined4 uVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  GpuArray<double,_21U> conc;
  Real h_RT [21];
  Real c_R [21];
  Real dcRdT [21];
  undefined8 local_1698;
  double dStack_1680;
  undefined8 local_1678;
  double local_1608 [17];
  undefined1 local_1580 [40];
  double local_1558;
  double adStack_1550 [9];
  undefined4 local_1508;
  undefined4 uStack_1504;
  double dStack_1500;
  double dStack_14f8;
  double local_14f0;
  double dStack_14e8;
  double local_14e0;
  double dStack_14d8;
  double local_14d0;
  double local_14c8;
  double dStack_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_1498;
  double local_1488;
  double dStack_1480;
  double local_1478;
  double dStack_1470;
  double local_1468;
  double dStack_1460;
  double local_1458;
  double dStack_1450;
  double local_1448;
  double dStack_1440;
  double local_1438;
  double dStack_1430;
  double local_1428;
  double dStack_1420;
  double local_1418;
  double dStack_1410;
  double local_1408;
  double dStack_1400;
  double local_13f8;
  double dStack_13f0;
  double local_13e8;
  double dStack_13e0;
  double local_13d8;
  double local_13c8;
  undefined8 uStack_13c0;
  double local_13b8;
  undefined8 uStack_13b0;
  double local_13a8;
  double dStack_13a0;
  double local_1398;
  double dStack_1390;
  double local_1388;
  undefined8 uStack_1380;
  double local_1378;
  double dStack_1370;
  double local_1368;
  double dStack_1360;
  double local_1358;
  double dStack_1350;
  double local_1348 [6];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  double local_12f8;
  double dStack_12f0;
  double local_12e8;
  double dStack_12e0;
  double local_12d8;
  double dStack_12d0;
  double local_12c8;
  double dStack_12c0;
  double local_12b8;
  double dStack_12b0;
  double local_12a8;
  double local_1298;
  double dStack_1290;
  double local_1288;
  double dStack_1280;
  double local_1270;
  double local_1268;
  undefined8 uStack_1260;
  double local_1258;
  undefined8 uStack_1250;
  double local_1248;
  double dStack_1240;
  double local_1238;
  double dStack_1230;
  double local_1228;
  double dStack_1220;
  double local_1210;
  double local_1208;
  int local_11fc;
  double local_11f8;
  double local_11f0;
  double dStack_11e8;
  double local_11e0;
  double local_11d8;
  double local_11d0;
  double local_11c8;
  double local_11c0;
  double local_11b8;
  double local_11b0;
  double local_11a8;
  double dStack_11a0;
  double local_1198;
  double local_1190;
  double local_1188;
  double local_1180 [2];
  double local_1170;
  double local_1168 [3];
  double adStack_1150 [36];
  undefined1 local_1030 [16];
  double local_1020;
  double local_1018;
  double local_1010;
  double local_1008;
  double local_fe8;
  double local_fe0;
  double local_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double local_fb0;
  double local_fa8;
  double local_fa0;
  double local_f98;
  double local_f90;
  double local_f88;
  double local_f80;
  double dStack_f78;
  double dStack_f70;
  double local_f68;
  double local_f60;
  double local_f38;
  double local_f30;
  double dStack_f28;
  double local_f20;
  double dStack_f18;
  double local_f10;
  double local_f08;
  double dStack_f00;
  double local_ef8;
  double local_ef0;
  double local_ee8;
  double local_ee0;
  double dStack_ed8;
  double local_ed0;
  double local_ec8;
  double dStack_ec0;
  double local_eb0;
  double local_ea8;
  double local_e88;
  double local_e80;
  double local_e78;
  double dStack_e70;
  double local_e68;
  double local_e60;
  double local_e58;
  double local_e50;
  double dStack_e48;
  double local_e40;
  double local_e38;
  double local_e30;
  double local_e20;
  double local_e18;
  double local_e00;
  double local_df8;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_dc0;
  double dStack_db8;
  double local_db0;
  double dStack_da8;
  double local_da0;
  double local_d90;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double dStack_d68;
  double dStack_d60;
  double local_d58;
  double local_d50;
  double local_d28;
  double local_d20;
  double local_d18;
  double local_d10;
  double local_d08;
  double local_d00;
  double local_cf8;
  double dStack_cf0;
  double local_ce8;
  double local_ce0;
  double local_cd8;
  double local_cc0;
  double local_cb8;
  double local_ca8;
  double local_c78;
  double local_c70;
  double local_c68;
  double local_c60;
  double local_c58;
  double local_c50;
  double local_c40;
  double local_c38;
  double local_c30;
  undefined1 local_c28 [16];
  double local_c18;
  double local_c10;
  double local_c08;
  double local_bf8;
  double local_bc8;
  double local_bc0;
  double dStack_bb8;
  double local_bb0;
  double dStack_ba8;
  double local_ba0;
  double local_b98;
  double local_b90;
  double dStack_b88;
  double local_b80;
  double local_b78;
  double local_b70;
  double local_b60;
  double dStack_b58;
  double local_b50;
  double local_b48;
  double dStack_b40;
  double local_b38;
  double local_b18;
  double local_b10;
  double local_b08;
  double local_b00;
  double local_af8;
  double local_af0;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab0;
  double local_aa8;
  double local_a90;
  double local_a88;
  double local_a68;
  double local_a60;
  double local_a58;
  double local_a50;
  double local_a48;
  double local_a40;
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a20;
  double local_a18;
  double dStack_a10;
  double dStack_a08;
  double dStack_a00;
  double local_9f8;
  double local_9b8;
  double local_9b0;
  double local_9a8;
  double local_9a0;
  double local_998;
  double local_988;
  double local_980;
  double local_978;
  double local_960;
  double local_958;
  double local_950;
  double local_948;
  double local_908;
  double local_900;
  double local_8f8;
  double local_8f0;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  double local_8c0;
  double local_8b8;
  double dStack_8b0;
  double dStack_8a8;
  double local_8a0;
  double local_898;
  double local_888;
  double local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  double dStack_820;
  double dStack_818;
  double local_810;
  double local_808;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d0;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_778;
  double local_760;
  double local_738;
  double local_730;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_690;
  double local_678;
  double local_670;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_600;
  double local_5f8;
  double local_5d8;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_598;
  double local_590;
  double local_588;
  double local_578;
  double local_570;
  double local_550;
  double local_548;
  double local_510;
  double local_508;
  double local_4e0;
  double local_4d0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_430;
  double local_420;
  double local_408;
  double local_400;
  double local_3f8;
  double local_388 [21];
  double local_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double *local_298;
  double *local_290;
  double local_288;
  double *local_280;
  double *local_278;
  int *local_270;
  double local_268 [22];
  double local_1b8 [22];
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_d0 [2];
  double local_c0 [2];
  double local_b0 [2];
  double local_a0 [2];
  double local_90 [2];
  double local_80 [2];
  double local_70 [2];
  double local_60 [2];
  double adStack_50 [2];
  double adStack_40 [2];
  
  local_270 = colPtrs;
  memset(adStack_1550 + 1,0,0xa8);
  pdVar48 = &local_d8;
  local_290 = adStack_50;
  local_278 = local_1b8 + 0x11;
  local_280 = local_1b8 + 0x13;
  local_298 = adStack_40;
  lVar46 = 1;
  auVar111 = _DAT_0074fb30;
  do {
    if (SUB164(auVar111 ^ _DAT_0074fb40,4) == -0x80000000 &&
        SUB164(auVar111 ^ _DAT_0074fb40,0) < -0x7fffffeb) {
      adStack_1550[lVar46] = 0.047619047619047616;
      adStack_1550[lVar46 + 1] = 0.047619047619047616;
    }
    lVar52 = auVar111._8_8_;
    auVar111._0_8_ = auVar111._0_8_ + 2;
    auVar111._8_8_ = lVar52 + 2;
    lVar46 = lVar46 + 2;
  } while (lVar46 != 0x17);
  local_11fc = *consP;
  __s = &local_11f8;
  lVar46 = 0;
  memset(__s,0,0xf20);
  memset(local_1608,0,0xa8);
  dVar63 = adStack_1550[8];
  dVar166 = adStack_1550[2];
  dVar163 = 0.0;
  do {
    dVar163 = dVar163 + adStack_1550[lVar46 + 1];
    lVar46 = lVar46 + 1;
  } while (lVar46 != 0x15);
  local_1478 = 2.9101473600491667;
  dStack_1470 = 19.482439934646393;
  local_1468 = 22.00757879476429;
  dStack_1460 = 3.2555381179699996;
  local_1458 = 6.1092103122075;
  dStack_1450 = -15.524086927680834;
  local_1448 = 5.3818731557687505;
  dStack_1440 = 35.602608086557915;
  local_1438 = 38.543891960460414;
  dStack_1430 = 17.114317783399166;
  local_1428 = 0.4349435637083328;
  dStack_1420 = -5.748131844745;
  local_1418 = -26.605086887896665;
  dStack_1410 = 7.7442483232375;
  local_1408 = -3.2271354189666677;
  dStack_1400 = 8.078776559375;
  local_13f8 = 12.395261584404166;
  dStack_13f0 = 18.914627724425003;
  local_13e8 = 3.874817692333335;
  dStack_13e0 = 3.0794231235708334;
  local_13d8 = 2.0030833333333335;
  dVar164 = adStack_1550[2] * adStack_1550[8];
  dVar59 = (((local_14a8 * -0.30000000000000004 +
             local_14b8 + local_14b8 +
             local_14f0 * 0.5 + adStack_1550[6] * 5.0 + adStack_1550[1] + dVar163 + dStack_14f8 +
             dStack_14e8) * 1e-12) / 71955998.06277587) * 2.2543283025642333e+17;
  dVar60 = log10(dVar59);
  dVar122 = 1.0 / ((dVar60 + -0.09006792635084097) * -0.14 + 1.3374831843797492);
  dVar61 = (dVar60 + -0.09006792635084097) * dVar122;
  dVar165 = 1.0 / (dVar61 * dVar61 + 1.0);
  dVar62 = pow(10.0,dVar165 * -0.46258518455098363);
  dVar125 = local_14f0;
  dVar64 = dStack_1500;
  dVar60 = adStack_1550[6];
  dVar123 = dVar165 * -0.9251703691019673 * dVar165 * dVar61 * dVar122;
  dVar122 = dVar123 * -1.3374831843797492 * dVar122;
  dVar62 = dVar62 * (dVar59 / (dVar59 + 1.0));
  dVar216 = (dVar164 * 71955998.06277587 + dStack_1500 * -0.15021418125880825) * dVar62;
  local_1608[7] = local_1608[7] - dVar216;
  lVar46 = 0;
  local_1348[0] = 0.0;
  local_1348[1] = dVar63 * dVar62 * 71955998.06277587 + 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1318._0_8_ = 0;
  local_1318._8_8_ = dVar62 * 71955998.06277587 * dVar166 + 0.0;
  local_1308._0_8_ = 0;
  local_1308._8_8_ = dVar62 * -0.15021418125880825 + 0.0;
  local_12f8 = 0.0;
  dStack_12f0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12d8 = 0.0;
  dStack_12d0 = 0.0;
  local_12c8 = 0.0;
  dStack_12c0 = 0.0;
  local_12b8 = 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  pdVar47 = &local_11b0;
  do {
    dVar63 = local_1348[lVar46];
    pdVar47[-8] = pdVar47[-8] - dVar63;
    pdVar47[-2] = pdVar47[-2] - dVar63;
    *pdVar47 = dVar63 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar63 = dVar62 * (dVar164 * -38376.53230014713 + dStack_1500 * -0.0036222377521367456) +
           ((dVar61 * dVar123 * -1.27 + dVar122 * -0.67 + dVar165) * -0.0001271297967317221 +
            dVar122 * -0.0005580285508678667 + -0.0005580285508678667 / (dVar59 + 1.0)) *
           2.302585092994046 * dVar216;
  pdVar47 = &local_11a8;
  local_388[1] = local_388[1] - dVar63;
  local_388[7] = local_388[7] - dVar63;
  local_388[9] = dVar63 + local_388[9];
  local_1368 = adStack_1550[1];
  local_1258 = dVar163 + adStack_1550[1];
  local_1488 = dStack_14f8;
  local_1358 = dStack_14e8;
  local_1498 = local_14b8;
  local_1288 = local_14b8 + local_14b8;
  local_13a8 = local_14f0 * 0.5 + adStack_1550[6] * 5.0 + local_1258 + dStack_14f8 + dStack_14e8 +
               local_1288;
  local_1558 = local_14a8;
  local_1228 = local_14a8 * -0.30000000000000004 + local_13a8;
  dStack_1220 = 0.0;
  dVar123 = local_1228 * 1e-12;
  dVar122 = (dVar123 / 111446030.23051862) * 8.322101603299873e+17;
  dVar165 = dVar166 * dStack_1500;
  dVar63 = log10(dVar122);
  local_13c8 = 1.0 / ((dVar63 + -0.1863137764834265) * -0.14 + 1.1550470206955945);
  local_1298 = (dVar63 + -0.1863137764834265) * local_13c8;
  local_1378 = 1.0 / (local_1298 * local_1298 + 1.0);
  dVar164 = pow(10.0,local_1378 * -0.31893466196503506);
  dVar62 = dStack_1470;
  dVar61 = local_14e0;
  dVar63 = local_1378 * -0.6378693239300701 * local_1378 * local_1298 * local_13c8;
  dVar59 = local_1298 * dVar63;
  dVar124 = dVar63 * -1.1550470206955945 * local_13c8;
  local_1298 = dStack_1430;
  dVar164 = dVar164 * (dVar122 / (dVar122 + 1.0));
  dVar63 = (dVar165 * 111446030.23051862 + local_1488 * -5.675915683847628) * dVar164;
  dVar237 = (local_1608[1] - dVar216) - dVar63;
  local_1608[1] = dVar237;
  dVar216 = (dVar216 + local_1608[9]) - dVar63;
  local_1608[9] = dVar216;
  local_1608[10] = dVar63 + local_1608[10];
  lVar46 = 0;
  local_1348[0] = 0.0;
  local_1348[1] = dVar64 * dVar164 * 111446030.23051862 + 0.0;
  local_1318 = ZEXT816(0);
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1308._0_8_ = 0;
  local_1308._8_8_ = dVar164 * 111446030.23051862 * dVar166 + 0.0;
  local_12f8 = dVar164 * -5.675915683847628 + 0.0;
  dStack_12f0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12d8 = 0.0;
  dStack_12d0 = 0.0;
  local_12c8 = 0.0;
  dStack_12c0 = 0.0;
  local_12b8 = 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  do {
    dVar64 = local_1348[lVar46];
    pdVar47[-9] = pdVar47[-9] - dVar64;
    pdVar47[-1] = pdVar47[-1] - dVar64;
    *pdVar47 = dVar64 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar63 = dVar164 * (dVar165 * -37261.015183856354 +
                     (((local_1428 - (dStack_1470 + dStack_1430)) + 1.0) * -0.0006666666666666666 +
                     -0.0003343413408874632) * -5.675915683847628 * local_1488) +
           ((dVar59 * -1.27 + dVar124 * -0.67 + local_1378) * -0.00011772029828908056 +
            dVar124 * -0.000995959489983554 + -0.000995959489983554 / (dVar122 + 1.0)) *
           2.302585092994046 * dVar63;
  pdVar47 = &local_1188;
  local_388[1] = local_388[1] - dVar63;
  local_388[9] = local_388[9] - dVar63;
  local_388[10] = dVar63 + local_388[10];
  dVar59 = (dVar123 / 39795255.79748703) * 5756549223630996.0;
  dVar166 = dVar166 * local_14e0;
  dVar63 = log10(dVar59);
  local_13c8 = 1.0 / ((dVar63 + -0.1786261669350975) * -0.14 + 1.1696190567051137);
  local_1378 = (dVar63 + -0.1786261669350975) * local_13c8;
  local_13b8 = 1.0 / (local_1378 * local_1378 + 1.0);
  dVar122 = pow(10.0,local_13b8 * -0.33040870606701866);
  dVar64 = dStack_14d8;
  dVar63 = adStack_1550[2];
  dVar164 = local_13b8 * -0.6608174121340373 * local_13b8 * local_1378 * local_13c8;
  dVar165 = dVar164 * -1.1696190567051137 * local_13c8;
  local_13c8 = local_1408;
  dVar122 = dVar122 * (dVar59 / (dVar59 + 1.0));
  dVar124 = (dVar166 * 39795255.79748703 + dStack_14d8 * -367.47982351959547) * dVar122;
  local_1608[0xd] = local_1608[0xd] - dVar124;
  lVar46 = 0;
  local_1348[0] = 0.0;
  local_1348[1] = dVar61 * dVar122 * 39795255.79748703 + 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1318 = ZEXT816(0);
  local_1308 = ZEXT816(0);
  local_12f8 = 0.0;
  dStack_12f0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = dVar122 * 39795255.79748703 * adStack_1550[2] + 0.0;
  local_12d8 = dVar122 * -367.47982351959547 + 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  dStack_12c0 = 0.0;
  local_12b8 = 0.0;
  dStack_12d0 = 0.0;
  local_12c8 = 0.0;
  do {
    dVar61 = local_1348[lVar46];
    pdVar47[-0xd] = pdVar47[-0xd] - dVar61;
    pdVar47[-1] = pdVar47[-1] - dVar61;
    *pdVar47 = dVar61 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar166 = dVar122 * (dVar166 * 10420.408369112773 +
                      (((local_1408 - (dStack_1410 + dVar62)) + 1.0) * -0.0006666666666666666 +
                      0.0002618505186181212) * -367.47982351959547 * dStack_14d8) +
            ((local_1378 * dVar164 * -1.27 + dVar165 * -0.67 + local_13b8) * -0.0001220771720522275
             + dVar165 * -0.0007194001075784557 + -0.0007194001075784557 / (dVar59 + 1.0)) *
            2.302585092994046 * dVar124;
  pdVar47 = local_1180;
  local_388[1] = local_388[1] - dVar166;
  local_388[0xd] = local_388[0xd] - dVar166;
  local_388[0xe] = dVar166 + local_388[0xe];
  dVar166 = ((local_13a8 * 1e-12) / 6244953.487472275) * 193693058799875.4;
  local_1378 = adStack_1550[2] * dStack_14d8;
  dStack_1370 = 0.0;
  local_13a8 = -0.001233681740997213 / (dVar166 + 1.0);
  dVar59 = log10(dVar166);
  local_13b8 = 1.0 / ((dVar59 + -0.09427787237484897) * -0.14 + 1.3295031374387192);
  local_1388 = (dVar59 + -0.09427787237484897) * local_13b8;
  local_1398 = 1.0 / (local_1388 * local_1388 + 1.0);
  dVar61 = pow(10.0,local_1398 * -0.4563016830226135);
  dVar122 = local_1398 * -0.912603366045227 * local_1398 * local_1388 * local_13b8;
  local_13b8 = dVar122 * -1.3295031374387192 * local_13b8;
  dVar61 = dVar61 * (dVar166 / (dVar166 + 1.0));
  dVar164 = (local_1378 * 6244953.487472275 + local_14d0 * -27501071940.071716) * dVar61;
  dVar166 = (dVar237 - dVar124) - dVar164;
  local_1608[1] = dVar166;
  dVar59 = (dVar124 + local_1608[0xe]) - dVar164;
  local_1608[0xe] = dVar59;
  local_1608[0xf] = dVar164 + local_1608[0xf];
  lVar46 = 0;
  local_1348[0] = 0.0;
  local_1348[1] = dVar61 * 6244953.487472275 * dVar64 + 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1318 = ZEXT816(0);
  local_1308 = ZEXT816(0);
  local_12f8 = 0.0;
  dStack_12f0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12d8 = dVar61 * 6244953.487472275 * dVar63 + 0.0;
  dStack_12d0 = dVar61 * -27501071940.071716 + 0.0;
  local_12c8 = 0.0;
  dStack_12c0 = 0.0;
  local_12b8 = 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  do {
    dVar165 = local_1348[lVar46];
    pdVar47[-0xe] = pdVar47[-0xe] - dVar165;
    pdVar47[-1] = pdVar47[-1] - dVar165;
    *pdVar47 = dVar165 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar61 = dVar61 * (local_1378 * 5521.547321046288 +
                    (((dStack_1400 - (dVar62 + local_13c8)) + 1.0) * -0.0006666666666666666 +
                    0.0008841614804854543) * -27501071940.071716 * local_14d0) +
           ((local_1388 * dVar122 * -1.27 + local_13b8 * -0.67 + local_1398) *
            -8.975305961941277e-05 + local_13b8 * -0.001233681740997213 + local_13a8) *
           2.302585092994046 * dVar164;
  pdVar47 = &local_1170;
  local_388[1] = local_388[1] - dVar61;
  local_388[0xe] = local_388[0xe] - dVar61;
  local_388[0xf] = dVar61 + local_388[0xf];
  local_1378 = local_14c8;
  dVar122 = (dVar123 / 16225653.552515732) * 7.275514395950915e+16;
  local_13b8 = dVar63 * local_14c8;
  uStack_13b0 = 0;
  local_13a8 = dVar122 / (dVar122 + 1.0);
  dVar61 = log10(dVar122);
  local_1388 = 1.0 / ((dVar61 + -0.015265883794403325) * -0.14 + 1.4792721307180714);
  local_1398 = (dVar61 + -0.015265883794403325) * local_1388;
  local_1268 = 1.0 / (local_1398 * local_1398 + 1.0);
  dVar164 = pow(10.0,local_1268 * -0.5742300241874577);
  dVar61 = dStack_13f0;
  dVar165 = local_1268 * -1.1484600483749154 * local_1268 * local_1398 * local_1388;
  local_1388 = dVar165 * -1.4792721307180714 * local_1388;
  dVar164 = dVar164 * local_13a8;
  dVar124 = (local_13b8 * 16225653.552515732 + dStack_14c0 * -67434469.58138922) * dVar164;
  local_1608[0x10] = local_1608[0x10] - dVar124;
  local_13a8 = dVar124 + (double)local_1580._0_8_;
  dStack_13a0 = (double)uStack_13b0;
  lVar46 = 0;
  local_1348[0] = 0.0;
  local_1348[1] = local_1378 * dVar164 * 16225653.552515732 + 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1318 = ZEXT816(0);
  local_1308 = ZEXT816(0);
  local_12f8 = 0.0;
  dStack_12f0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12d8 = 0.0;
  dStack_12d0 = 0.0;
  local_12c8 = dVar164 * 16225653.552515732 * dVar63 + 0.0;
  dStack_12c0 = dVar164 * -67434469.58138922 + 0.0;
  local_12b8 = 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  do {
    dVar237 = local_1348[lVar46];
    pdVar47[-0x10] = pdVar47[-0x10] - dVar237;
    pdVar47[-1] = pdVar47[-1] - dVar237;
    *pdVar47 = dVar237 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar122 = dVar164 * (local_13b8 * 11515.557849353894 +
                      (((dStack_13f0 - (local_13f8 + dVar62)) + 1.0) * -0.0006666666666666666 +
                      0.0007097130363398179) * -67434469.58138922 * dStack_14c0) +
            ((local_1398 * dVar165 * -1.27 + local_1388 * -0.67 + local_1268) *
             -0.00018029438599527205 + local_1388 * -0.0018374389917122033 +
            -0.0018374389917122033 / (dVar122 + 1.0)) * 2.302585092994046 * dVar124;
  pdVar47 = local_1168;
  local_388[1] = local_388[1] - dVar122;
  local_388[0x10] = local_388[0x10] - dVar122;
  local_388[0x11] = dVar122 + local_388[0x11];
  dVar122 = (dVar123 / 219941642.44158944) * 6.888873607161395e+17;
  local_1398 = dVar63 * dStack_14c0;
  dStack_1390 = 0.0;
  local_13b8 = dVar122 / (dVar122 + 1.0);
  local_1388 = -0.001267383041404717 / (dVar122 + 1.0);
  local_1378 = dStack_14c0;
  dVar122 = log10(dVar122);
  local_1268 = 1.0 / ((dVar122 + -0.1601631500988638) * -0.14 + 1.2046161184693178);
  local_1238 = (dVar122 + -0.1601631500988638) * local_1268;
  local_1248 = 1.0 / (local_1238 * local_1238 + 1.0);
  dVar164 = pow(10.0,local_1248 * -0.35796544761363613);
  dVar122 = local_13e8;
  dVar165 = local_1248 * -0.7159308952272723 * local_1248 * local_1238 * local_1268;
  dVar237 = dVar165 * -1.2046161184693178 * local_1268;
  dVar164 = dVar164 * local_13b8;
  dVar247 = (local_1398 * 219941642.44158944 + local_1498 * -123.84112181745292) * dVar164;
  dVar166 = (dVar166 - dVar124) - dVar247;
  local_1608[1] = dVar166;
  lVar46 = 0;
  local_1348[0] = 0.0;
  local_1348[1] = local_1378 * dVar164 * 219941642.44158944 + 0.0;
  local_12c8 = 0.0;
  local_12d8 = 0.0;
  dStack_12d0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12f8 = 0.0;
  dStack_12f0 = 0.0;
  local_1308 = ZEXT816(0);
  local_1318 = ZEXT816(0);
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  dStack_12c0 = dVar164 * 219941642.44158944 * dVar63 + 0.0;
  local_12b8 = dVar164 * -123.84112181745292 + 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  local_1378 = dVar247 + (double)local_1580._8_8_;
  dStack_1370 = dStack_1390;
  local_1580._8_8_ = dVar247 + (double)local_1580._8_8_;
  local_1580._0_8_ = local_13a8 - dVar247;
  do {
    dVar124 = local_1348[lVar46];
    pdVar47[-0x11] = pdVar47[-0x11] - dVar124;
    pdVar47[-1] = pdVar47[-1] - dVar124;
    *pdVar47 = dVar124 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar61 = dVar164 * (local_1398 * -67440.72224696395 +
                     (((local_13e8 - (dVar61 + dVar62)) + 1.0) * -0.0006666666666666666 +
                     -0.0003066300746793522) * -123.84112181745292 * local_1498) +
           ((local_1238 * dVar165 * -1.27 + dVar237 * -0.67 + local_1248) * -0.00016037027791424038
            + dVar237 * -0.001267383041404717 + local_1388) * 2.302585092994046 * dVar247;
  pdVar47 = &local_1188;
  local_388[1] = local_388[1] - dVar61;
  local_388[0x11] = local_388[0x11] - dVar61;
  local_388[0x12] = dVar61 + local_388[0x12];
  dVar61 = (dVar123 / 6.312363615626772e-06) * 35752.450724543516;
  local_1388 = local_1368 * dVar125;
  local_13b8 = dVar61 / (dVar61 + 1.0);
  local_13a8 = -0.0009631147670810994 / (dVar61 + 1.0);
  dVar61 = log10(dVar61);
  local_1398 = 1.0 / ((dVar61 + -0.09697718965666909) * -0.14 + 1.3243865210985526);
  local_1268 = (dVar61 + -0.09697718965666909) * local_1398;
  local_1238 = 1.0 / (local_1268 * local_1268 + 1.0);
  dVar124 = pow(10.0,local_1238 * -0.45227285125870287);
  dVar165 = dStack_1500;
  dVar61 = local_1238 * -0.9045457025174057 * local_1238 * local_1268 * local_1398;
  dVar164 = dVar61 * -1.3243865210985526 * local_1398;
  dVar164 = (local_1268 * dVar61 * -1.27 + dVar164 * -0.67 + local_1238) * -0.0002754907583934973 +
            dVar164 * -0.0009631147670810994 + local_13a8;
  local_13a8 = dStack_1420;
  dVar124 = dVar124 * local_13b8;
  dVar61 = (local_1388 * 6.312363615626772e-06 + dVar64 * -115.13226896846228) * dVar124;
  local_1608[0] = local_1608[0] - dVar61;
  dVar237 = local_1608[0xb] - dVar61;
  local_1608[0xb] = dVar237;
  local_1608[0xe] = dVar61 + dVar59;
  local_1348[0] = dVar124 * 6.312363615626772e-06 * dVar125 + 0.0;
  local_1348[1] = 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1318 = ZEXT816(0);
  local_1308 = ZEXT816(0);
  local_12f8 = 0.0;
  dStack_12f0 = dVar124 * 6.312363615626772e-06 * local_1368 + 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12d8 = dVar124 * -115.13226896846228 + 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  dStack_12c0 = 0.0;
  local_12b8 = 0.0;
  dStack_12d0 = 0.0;
  local_12c8 = 0.0;
  lVar46 = 0;
  do {
    dVar59 = local_1348[lVar46];
    pdVar47[-0xe] = pdVar47[-0xe] - dVar59;
    pdVar47[-3] = pdVar47[-3] - dVar59;
    *pdVar47 = dVar59 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar64 = dVar124 * (local_1388 * 1.1868939967403452e-07 +
                     (((local_13c8 - (local_1478 + dStack_1420)) + 1.0) * -0.0006666666666666666 +
                     0.01880268737691365) * -115.13226896846228 * dVar64) +
           dVar164 * 2.302585092994046 * dVar61;
  pdVar47 = &local_11b0;
  local_388[0] = local_388[0] - dVar64;
  local_388[0xb] = local_388[0xb] - dVar64;
  local_388[0xe] = dVar64 + local_388[0xe];
  dVar64 = (dVar123 / 14295380.788738592) * 4.2554035761159823e+18;
  local_13c8 = dStack_1500 * dStack_1500;
  local_1368 = -0.001974975711261012 / (dVar64 + 1.0);
  dVar59 = log10(dVar64);
  local_13b8 = 1.0 / ((dVar59 + 0.12973051019251233) * -0.14 + 1.7541160417081951);
  local_1388 = (dVar59 + 0.12973051019251233) * local_13b8;
  local_1398 = 1.0 / (local_1388 * local_1388 + 1.0);
  dVar59 = pow(10.0,local_1398 * -0.7906425525261378);
  dVar61 = local_1398 * -1.5812851050522756 * local_1398 * local_1388 * local_13b8;
  local_13b8 = dVar61 * -1.7541160417081951 * local_13b8;
  dVar59 = dVar59 * (dVar64 / (dVar64 + 1.0));
  dVar64 = (local_13c8 * 14295380.788738592 + local_1498 * -4338.16492800087) * dVar59;
  dVar123 = local_1378 + dVar64;
  local_1608[9] = dVar216 - (dVar64 + dVar64);
  local_1580._8_8_ = dVar123;
  local_1348[0] = 0.0;
  local_1348[1] = 0.0;
  local_1348[2] = 0.0;
  local_1348[3] = 0.0;
  local_1348[4] = 0.0;
  local_1348[5] = 0.0;
  local_1318 = ZEXT816(0);
  local_1308._0_8_ = 0;
  local_1308._8_8_ = (dVar59 * 14295380.788738592 + dVar59 * 14295380.788738592) * dVar165 + 0.0;
  local_12c8 = 0.0;
  dStack_12c0 = 0.0;
  local_12d8 = 0.0;
  dStack_12d0 = 0.0;
  local_12e8 = 0.0;
  dStack_12e0 = 0.0;
  local_12f8 = 0.0;
  dStack_12f0 = 0.0;
  local_12b8 = dVar59 * -4338.16492800087 + 0.0;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  lVar46 = 0;
  do {
    dVar164 = local_1348[lVar46];
    *pdVar47 = *pdVar47 - (dVar164 + dVar164);
    pdVar47[9] = dVar164 + pdVar47[9];
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar64 = dVar59 * (local_13c8 * -7262.089447255807 +
                    (((dVar122 - (local_1298 + local_1298)) + 1.0) * -0.0006666666666666666 +
                    -0.0005080025187560327) * -4338.16492800087 * local_1498) +
           ((local_1388 * dVar61 * -1.27 + local_13b8 * -0.67 + local_1398) *
            -0.00010911464158415095 + local_13b8 * -0.001974975711261012 + local_1368) *
           2.302585092994046 * dVar64;
  pdVar47 = &local_11f0;
  local_388[9] = local_388[9] - (dVar64 + dVar64);
  local_388[0x12] = dVar64 + local_388[0x12];
  local_1348[3] =
       dVar63 * adStack_1550[3] * 333.3333333333333 + adStack_1550[5] * -7.276980120178465e-07;
  dVar64 = local_1228 * local_1348[3];
  local_1608[1] = dVar166 - dVar64;
  local_1608[2] = local_1608[2] - dVar64;
  local_1608[4] = dVar64 + local_1608[4];
  local_1348[1] = adStack_1550[3] * local_1228 * 333.3333333333333 + local_1348[3];
  local_1348[2] = dVar63 * local_1228 * 333.3333333333333 + local_1348[3];
  local_1348[4] = local_1228 * -7.276980120178465e-07 + local_1348[3];
  local_1348[5] = local_1348[3] * 6.0;
  local_1308._8_8_ = local_1348[3];
  local_1308._0_8_ = local_1348[3];
  local_1318._8_8_ = local_1348[3];
  local_1318._0_8_ = local_1348[3];
  local_1348[0] = local_1348[3] * 2.0;
  local_12f8 = local_1348[0];
  dStack_12f0 = local_1348[3] * 1.5;
  local_12e8 = local_1348[0];
  dStack_12d0 = local_1348[3];
  local_12c8 = local_1348[3];
  dStack_12e0 = local_1348[3];
  local_12d8 = local_1348[3];
  dStack_12c0 = local_1348[3];
  local_12b8 = local_1348[3] * 3.0;
  dStack_12b0 = local_1348[3];
  local_12a8 = local_1348[3] * 0.7;
  lVar46 = 0;
  pdVar51 = local_1b8 + 5;
  pdVar55 = local_1b8 + 7;
  pdVar56 = local_1b8 + 9;
  pdVar57 = local_1b8 + 0xb;
  do {
    dVar166 = local_1348[lVar46];
    *pdVar47 = *pdVar47 - dVar166;
    pdVar47[1] = pdVar47[1] - dVar166;
    pdVar47[3] = dVar166 + pdVar47[3];
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  local_1228 = local_1228 *
               (dVar63 * adStack_1550[3] * -0.2222222222222222 +
               (((local_1458 - (dVar62 + local_1468)) + 1.0) * -0.0006666666666666666 +
               -0.0006666666666666666) * -7.276980120178465e-07 * adStack_1550[5]);
  pdVar47 = &local_1198;
  local_388[1] = local_388[1] - local_1228;
  local_388[2] = local_388[2] - local_1228;
  local_388[4] = local_1228 + local_388[4];
  dVar166 = local_1558 * -0.5 +
            local_1288 +
            local_1358 * 2.5 +
            dVar125 * 0.5 + dVar60 * 5.0 + adStack_1550[4] * 5.0 + local_1258 + local_1488;
  local_1348[1] = adStack_1550[3] * dVar125 * 220.0432490668822 + local_1358 * -3.54614235835121e-08
  ;
  dVar64 = local_1348[1] * dVar166;
  local_1608[2] = local_1608[2] - dVar64;
  local_1608[0xb] = dVar237 - dVar64;
  local_1608[0xc] = dVar64 + local_1608[0xc];
  local_1348[0] = local_1348[1] + local_1348[1];
  local_1348[2] = dVar166 * 220.0432490668822 * dVar125 + local_1348[1];
  local_1348[3] = local_1348[1] * 6.0;
  local_1348[4] = local_1348[1];
  local_1348[5] = local_1348[1] * 6.0;
  uVar191 = SUB84(local_1348[1],0);
  uVar192 = (undefined4)((ulong)local_1348[1] >> 0x20);
  local_1308._8_4_ = uVar191;
  local_1308._0_8_ = local_1348[1];
  local_1308._12_4_ = uVar192;
  local_1318._8_4_ = uVar191;
  local_1318._0_8_ = local_1348[1];
  local_1318._12_4_ = uVar192;
  local_12f8 = local_1348[1] + local_1348[1];
  dStack_12f0 = local_1348[1] * 1.5 + adStack_1550[3] * dVar166 * 220.0432490668822;
  local_12e8 = local_1348[1] * 3.5 + dVar166 * -3.54614235835121e-08;
  auVar17._8_4_ = uVar191;
  auVar17._0_8_ = local_1348[1];
  auVar17._12_4_ = uVar192;
  dStack_12d0 = local_1348[1];
  local_12c8 = auVar17._8_8_;
  auVar18._8_4_ = uVar191;
  auVar18._0_8_ = local_1348[1];
  auVar18._12_4_ = uVar192;
  dStack_12e0 = local_1348[1];
  local_12d8 = auVar18._8_8_;
  dStack_12c0 = local_1348[1];
  local_12b8 = local_1348[1] * 3.0;
  dStack_12b0 = local_1348[1];
  local_12a8 = local_1348[1] * 0.5;
  lVar46 = 0;
  pdVar58 = local_1b8 + 0xd;
  do {
    dVar64 = local_1348[lVar46];
    pdVar47[-10] = pdVar47[-10] - dVar64;
    pdVar47[-1] = pdVar47[-1] - dVar64;
    *pdVar47 = dVar64 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar166 = dVar166 * (adStack_1550[3] * dVar125 * 0.14763924017103203 +
                      (((local_1418 - (local_1468 + local_13a8)) + 1.0) * -0.0006666666666666666 +
                      0.0006709555544062933) * -3.54614235835121e-08 * local_1358);
  pdVar47 = &local_11f0;
  local_388[2] = local_388[2] - dVar166;
  local_388[0xb] = local_388[0xb] - dVar166;
  local_388[0xc] = dVar166 + local_388[0xc];
  local_1558 = ((local_1498 * 0.5 +
                local_1358 * 0.5 + dVar125 * -0.25 + ((dVar163 - adStack_1550[4]) - dVar60)) -
               local_14b0) - local_1558;
  dVar166 = adStack_1550[4] * dVar63;
  local_1348[0] = dVar166 * 5196.603105918946 + adStack_1550[7] * -515.2276090538855;
  local_1348[1] = local_1558 * 5196.603105918946 * adStack_1550[4] + local_1348[0];
  local_1348[2] = local_1348[0];
  local_1348[3] = local_1558 * 5196.603105918946 * dVar63;
  local_1348[4] = local_1348[0];
  local_1348[5] = 0.0;
  local_12f8 = local_1348[0];
  local_1318._0_8_ = local_1558 * -515.2276090538855 + local_1348[0];
  local_1318._8_8_ = local_1348[0];
  local_1308._0_8_ = local_1348[0];
  local_1308._8_8_ = local_1348[0];
  dStack_12f0 = local_1348[0] * 0.75;
  local_12e8 = local_1348[0] * 1.5;
  dStack_12d0 = local_1348[0];
  local_12c8 = local_1348[0];
  dStack_12e0 = local_1348[0];
  local_12d8 = local_1348[0];
  dVar64 = local_1558 * local_1348[0];
  dStack_12c0 = local_1348[0];
  local_1608[1] = local_1608[1] - dVar64;
  local_12b8 = local_1348[0] * 1.5;
  dStack_12b0 = 0.0;
  local_12a8 = 0.0;
  local_1608[3] = local_1608[3] - dVar64;
  local_1608[6] = dVar64 + local_1608[6];
  lVar46 = 0;
  do {
    dVar64 = local_1348[lVar46];
    *pdVar47 = *pdVar47 - dVar64;
    pdVar47[2] = pdVar47[2] - dVar64;
    pdVar47[5] = dVar64 + pdVar47[5];
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  local_1558 = local_1558 *
               (dVar166 * -2.979385780726863 +
               (((local_1448 - (dVar62 + dStack_1460)) + 1.0) * -0.0006666666666666666 +
               -0.0005733333333333334) * -515.2276090538855 * adStack_1550[7]);
  dVar64 = adStack_1550[4] * adStack_1550[4] * dVar63;
  dVar122 = dVar64 * 1033.3424938946343 + adStack_1550[4] * adStack_1550[7] * -102.45280842339088;
  dVar299 = dVar64 * -1.1848993929991807 +
            ((((dStack_1460 + local_1448) - (dStack_1460 + dStack_1460 + dVar62)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -102.45280842339088 *
            adStack_1550[4] * adStack_1550[7];
  pdVar47 = &local_11f0;
  dVar64 = adStack_1550[4] * adStack_1550[4] * 1033.3424938946343;
  dVar247 = (dVar63 * 1033.3424938946343 + dVar63 * 1033.3424938946343) * adStack_1550[4] +
            adStack_1550[7] * -102.45280842339088;
  dVar125 = adStack_1550[4] * -102.45280842339088;
  dVar61 = dVar166 * dVar60 * 36172.079901627476 + adStack_1550[7] * dVar60 * -3586.3532123502373;
  dVar63 = dVar166 * dVar60 * -18.327187150157922 +
           ((((dStack_1450 + local_1448) - (dVar62 + dStack_1460 + dStack_1450)) + 1.0) *
            -0.0006666666666666666 + -0.0005066666666666667) * -3586.3532123502373 *
           adStack_1550[7] * dVar60;
  dVar164 = adStack_1550[4] * 36172.079901627476 * adStack_1550[6];
  dVar60 = adStack_1550[6] * adStack_1550[2] * 36172.079901627476;
  dVar166 = adStack_1550[2] * 36172.079901627476 * adStack_1550[4] +
            adStack_1550[7] * -3586.3532123502373;
  local_e80 = local_e80 - dVar166;
  dStack_e70 = dStack_e70 - dVar166;
  local_e58 = dVar166 + local_e58;
  dVar308 = adStack_1550[6] * -3586.3532123502373;
  dVar166 = adStack_1550[4] * adStack_1550[2] * local_14b0;
  dVar237 = dVar166 * 1291.6781173682928 + adStack_1550[7] * local_14b0 * -128.06601052923858;
  dVar124 = dVar166 * -1.4811242412489758 +
            ((((dStack_13e0 + local_1448) - (dStack_1470 + dStack_1460 + dStack_13e0)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -128.06601052923858 *
            adStack_1550[7] * local_14b0;
  dVar216 = local_14b0 * adStack_1550[2] * 1291.6781173682928;
  dVar62 = adStack_1550[4] * 1291.6781173682928 * local_14b0;
  dVar316 = local_14b0 * -128.06601052923858;
  dVar166 = adStack_1550[2] * 1291.6781173682928 * adStack_1550[4] +
            adStack_1550[7] * -128.06601052923858;
  local_4e0 = local_4e0 - dVar166;
  local_4d0 = local_4d0 - dVar166;
  local_4b8 = dVar166 + local_4b8;
  dVar166 = adStack_1550[4] * adStack_1550[2] * local_14a8;
  dVar165 = dVar166 * 2014.7679457577242 + adStack_1550[7] * local_14a8 * -199.75819787137542;
  dVar59 = dVar166 * -1.0745429044041197 +
           ((((local_13d8 + local_1448) - (dStack_1470 + dStack_1460 + local_13d8)) + 1.0) *
            -0.0006666666666666666 + -0.0005333333333333334) * -199.75819787137542 *
           adStack_1550[7] * local_14a8;
  local_1608[3] = (((local_1608[3] - dVar122) - dVar61) - dVar237) - dVar165;
  local_1608[6] = dVar165 + dVar237 + dVar61 + dVar122 + local_1608[6];
  dVar166 = adStack_1550[4] * 2014.7679457577242 * local_14a8;
  adStack_1150[2] = (((adStack_1150[2] - dVar64) - dVar164) - dVar62) - dVar166;
  adStack_1150[4] = (((adStack_1150[4] - dVar64) - dVar164) - dVar62) - dVar166;
  adStack_1150[7] = dVar166 + dVar62 + dVar164 + dVar64 + adStack_1150[7];
  dVar166 = local_14a8 * adStack_1550[2] * 2014.7679457577242;
  local_fe0 = (((local_fe0 - dVar247) - dVar60) - dVar216) - dVar166;
  dStack_fd0 = (((dStack_fd0 - dVar247) - dVar60) - dVar216) - dVar166;
  dStack_fb8 = dVar166 + dVar216 + dVar60 + dVar247 + dStack_fb8;
  dVar166 = local_14a8 * -199.75819787137542;
  local_dd0 = (((local_dd0 - dVar125) - dVar308) - dVar316) - dVar166;
  local_dc0 = (((local_dc0 - dVar125) - dVar308) - dVar316) - dVar166;
  dStack_da8 = dVar166 + dVar316 + dVar308 + dVar125 + dStack_da8;
  dVar166 = adStack_1550[2] * 2014.7679457577242 * adStack_1550[4] +
            adStack_1550[7] * -199.75819787137542;
  local_430 = local_430 - dVar166;
  local_420 = local_420 - dVar166;
  local_408 = dVar166 + local_408;
  local_388[1] = ((((local_388[1] - local_1558) - dVar299) - dVar63) - dVar124) - dVar59;
  local_388[3] = ((((local_388[3] - local_1558) - dVar299) - dVar63) - dVar124) - dVar59;
  local_388[6] = dVar59 + dVar124 + dVar63 + dVar299 + local_1558 + local_388[6];
  dVar64 = local_14a8 * -0.37 +
           local_14b8 + local_14b8 +
           ((((dVar163 - adStack_1550[1]) - adStack_1550[6]) + dStack_14f8) - dStack_14e8);
  dVar166 = adStack_1550[2] * adStack_1550[2];
  dVar60 = dStack_1470 + dStack_1470;
  local_1348[2] = dVar166 * 666.6666666666666 + adStack_1550[1] * -1.6792101947629015e-06;
  local_1348[0] = dVar64 * -1.6792101947629015e-06;
  local_1348[1] =
       (dVar64 * 666.6666666666666 + dVar64 * 666.6666666666666) * adStack_1550[2] + local_1348[2];
  local_1348[3] = local_1348[2];
  local_1348[4] = local_1348[2];
  lVar46 = 0;
  local_1348[5] = 0.0;
  local_1308._0_8_ = local_1348[2];
  local_1308._8_8_ = local_1348[2];
  local_1318._0_8_ = local_1348[2];
  local_1318._8_8_ = local_1348[2];
  local_12f8 = local_1348[2] + local_1348[2];
  dVar63 = local_1348[2] * dVar64;
  dStack_12f0 = local_1348[2];
  local_12e8 = 0.0;
  dStack_12d0 = local_1348[2];
  local_12c8 = local_1348[2];
  dStack_12e0 = local_1348[2];
  local_12d8 = local_1348[2];
  dStack_12c0 = local_1348[2];
  local_12b8 = local_1348[2] * 3.0;
  local_1608[0] = local_1608[0] + dVar63;
  dStack_12b0 = local_1348[2];
  local_1608[1] = ((((local_1608[1] - dVar122) - dVar61) - dVar237) - dVar165) - (dVar63 + dVar63);
  local_12a8 = local_1348[2] * 0.63;
  pdVar53 = local_1b8 + 0xf;
  do {
    dVar63 = local_1348[lVar46];
    pdVar47[-1] = pdVar47[-1] + dVar63;
    *pdVar47 = *pdVar47 - (dVar63 + dVar63);
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar64 = dVar64 * (dVar166 * -0.4444444444444444 +
                    (((local_1478 - dVar60) + 1.0) * -0.0006666666666666666 + -0.0006666666666666666
                    ) * -1.6792101947629015e-06 * adStack_1550[1]);
  pdVar47 = &local_11d0;
  dVar122 = dVar166 * adStack_1550[1] * 1118.3757819574057 +
            adStack_1550[1] * adStack_1550[1] * -2.8169820219582113e-06;
  dVar165 = dVar166 * adStack_1550[1] * -0.4473503127829622 +
            (-0.00039999999999999996 -
            (((local_1478 + local_1478) - (dVar60 + local_1478)) + 1.0) * 0.0006666666666666666) *
            -2.8169820219582113e-06 * adStack_1550[1] * adStack_1550[1];
  dVar164 = dVar166 * 1118.3757819574057 + adStack_1550[1] * -5.633964043916423e-06;
  dVar59 = (adStack_1550[1] * 1118.3757819574057 + adStack_1550[1] * 1118.3757819574057) *
           adStack_1550[2];
  dVar216 = dVar166 * adStack_1550[6] * 6427.427351557215 +
            adStack_1550[1] * adStack_1550[6] * -1.618950230224919e-05;
  dVar63 = dVar166 * adStack_1550[6] * -5.356189459631012 +
           (-0.0008333333333333333 -
           (((dStack_1450 + local_1478) - (dVar60 + dStack_1450)) + 1.0) * 0.0006666666666666666) *
           -1.618950230224919e-05 * adStack_1550[1] * adStack_1550[6];
  dVar62 = adStack_1550[6] * -1.618950230224919e-05;
  dVar61 = adStack_1550[2] * 12854.85470311443 * adStack_1550[6];
  dVar125 = dVar166 * 6427.427351557215 + adStack_1550[1] * -1.618950230224919e-05;
  local_e88 = local_e88 + dVar125;
  local_e80 = local_e80 - (dVar125 + dVar125);
  dVar124 = dVar166 * dStack_14e8 * 244.44444444444443 +
            adStack_1550[1] * dStack_14e8 * -6.157104047463972e-07;
  dVar125 = dVar166 * dStack_14e8 * -0.3259259259259259 +
            (-0.0013333333333333333 -
            (((local_1418 + local_1478) - (dVar60 + local_1418)) + 1.0) * 0.0006666666666666666) *
            -6.157104047463972e-07 * adStack_1550[1] * dStack_14e8;
  local_1608[0] = local_1608[0] + dVar122 + dVar216 + dVar124;
  dVar166 = adStack_1550[2] * 488.88888888888886 * dStack_14e8;
  dVar60 = dStack_14e8 * -6.157104047463972e-07;
  local_11f8 = local_11f8 + dVar164 + dVar62 + dVar60;
  local_11f0 = ((local_11f0 - (dVar164 + dVar164)) - (dVar62 + dVar62)) - (dVar60 + dVar60);
  adStack_1150[1] = adStack_1150[1] + dVar59 + dVar61 + dVar166;
  adStack_1150[2] =
       ((adStack_1150[2] - (dVar59 + dVar59)) - (dVar61 + dVar61)) - (dVar166 + dVar166);
  dVar166 = adStack_1550[2] * adStack_1550[2] * 244.44444444444443 +
            adStack_1550[1] * -6.157104047463972e-07;
  local_9b8 = local_9b8 + dVar166;
  local_9b0 = local_9b0 - (dVar166 + dVar166);
  local_388[0] = local_388[0] + dVar64 + dVar165 + dVar63 + dVar125;
  local_388[1] = (((local_388[1] - (dVar64 + dVar64)) - (dVar165 + dVar165)) - (dVar63 + dVar63)) -
                 (dVar125 + dVar125);
  dVar166 = local_14a8 * -0.62 +
            local_14b8 + local_14b8 +
            adStack_1550[6] * 2.65 + adStack_1550[1] * -0.27 + dVar163 + dStack_14f8;
  local_1348[2] =
       adStack_1550[2] * adStack_1550[5] * 9777.777777777777 +
       adStack_1550[6] * -7.029234294042697e-07;
  dVar63 = dVar166 * local_1348[2];
  local_1608[1] =
       (((local_1608[1] - (dVar122 + dVar122)) - (dVar216 + dVar216)) - (dVar124 + dVar124)) -
       dVar63;
  local_1608[4] = local_1608[4] - dVar63;
  local_1608[5] = dVar63 + local_1608[5];
  local_1348[0] = local_1348[2] * 0.73;
  local_1348[1] = adStack_1550[5] * dVar166 * 9777.777777777777 + local_1348[2];
  local_1348[3] = local_1348[2];
  local_1348[4] = local_1348[2] + adStack_1550[2] * dVar166 * 9777.777777777777;
  local_1348[5] = dVar166 * -7.029234294042697e-07 + local_1348[2] * 3.65;
  local_1308._8_8_ = local_1348[2];
  local_1308._0_8_ = local_1348[2];
  local_1318._8_8_ = local_1348[2];
  local_1318._0_8_ = local_1348[2];
  local_12f8 = local_1348[2] + local_1348[2];
  dStack_12e0 = local_1348[2];
  local_12d8 = local_1348[2];
  dStack_12f0 = local_1348[2];
  local_12e8 = local_1348[2];
  dStack_12d0 = local_1348[2];
  local_12c8 = local_1348[2];
  dStack_12c0 = local_1348[2];
  local_12b8 = local_1348[2] * 3.0;
  dStack_12b0 = local_1348[2];
  local_12a8 = local_1348[2] * 0.38;
  lVar46 = 0;
  do {
    dVar63 = local_1348[lVar46];
    pdVar47[-4] = pdVar47[-4] - dVar63;
    pdVar47[-1] = pdVar47[-1] - dVar63;
    *pdVar47 = dVar63 + *pdVar47;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar166 = dVar166 * (adStack_1550[2] * adStack_1550[5] * -13.037037037037036 +
                      (-0.0013333333333333333 -
                      ((dStack_1450 - (local_1458 + dStack_1470)) + 1.0) * 0.0006666666666666666) *
                      -7.029234294042697e-07 * adStack_1550[6]);
  pdVar47 = &local_1190;
  local_388[4] = local_388[4] - dVar166;
  local_388[5] = dVar166 + local_388[5];
  dVar63 = adStack_1550[2] * adStack_1550[6] * local_14f0;
  dVar64 = adStack_1550[6] * local_14e0 * 4989960.261382571 + dVar63 * -1002.9930150071424;
  dVar63 = adStack_1550[6] * local_14e0 * 15645.595296379073 +
           (0.0031354148083023287 -
           (((dStack_1470 + dStack_1450 + dStack_1420) - (dStack_1450 + dStack_1410)) + -1.0) *
           0.0006666666666666666) * -1002.9930150071424 * dVar63;
  dVar60 = adStack_1550[6] * -1002.9930150071424 * local_14f0;
  adStack_1150[2] = adStack_1150[2] + dVar60;
  adStack_1150[0xc] = adStack_1150[0xc] + dVar60;
  adStack_1150[0xe] = adStack_1150[0xe] - dVar60;
  dVar60 = local_14e0 * 4989960.261382571 + local_14f0 * adStack_1550[2] * -1002.9930150071424;
  local_e80 = local_e80 + dVar60;
  local_e30 = local_e30 + dVar60;
  local_e20 = local_e20 - dVar60;
  dVar60 = adStack_1550[2] * -1002.9930150071424 * adStack_1550[6];
  local_a60 = local_a60 + dVar60;
  dStack_a10 = dStack_a10 + dVar60;
  dStack_a00 = dStack_a00 - dVar60;
  dVar60 = adStack_1550[6] * 4989960.261382571;
  local_900 = local_900 + dVar60;
  dStack_8b0 = dStack_8b0 + dVar60;
  local_8a0 = local_8a0 - dVar60;
  local_388[1] = (local_388[1] - dVar166) + dVar63;
  local_388[0xb] = local_388[0xb] + dVar63;
  local_388[0xd] = local_388[0xd] - dVar63;
  dVar166 = local_14b8 + local_14b8 +
            local_14f0 * 0.5 + ((dVar163 + adStack_1550[1]) - adStack_1550[6]) + dStack_14f8 +
            dStack_14e8;
  local_1348[2] = local_14e0 * 415830.02178188093 + local_14f0 * adStack_1550[2] * -83.5827512505952
  ;
  local_1348[0] = local_1348[2] + local_1348[2];
  local_1348[1] = local_14f0 * dVar166 * -83.5827512505952 + local_1348[2];
  local_1348[3] = local_1348[2];
  local_1348[4] = local_1348[2];
  local_1348[5] = 0.0;
  uVar191 = SUB84(local_1348[2],0);
  uVar192 = (undefined4)((ulong)local_1348[2] >> 0x20);
  local_1308._8_4_ = uVar191;
  local_1308._0_8_ = local_1348[2];
  local_1308._12_4_ = uVar192;
  local_1318._8_4_ = uVar191;
  local_1318._0_8_ = local_1348[2];
  local_1318._12_4_ = uVar192;
  local_12f8 = local_1348[0];
  dStack_12f0 = local_1348[2] * 1.5 + dVar166 * -83.5827512505952 * adStack_1550[2];
  local_12e8 = local_1348[0];
  dStack_12e0 = dVar166 * 415830.02178188093 + local_1348[2];
  auVar19._8_4_ = uVar191;
  auVar19._0_8_ = local_1348[2];
  auVar19._12_4_ = uVar192;
  local_12c8 = local_1348[2];
  dStack_12c0 = auVar19._8_8_;
  auVar20._8_4_ = uVar191;
  auVar20._0_8_ = local_1348[2];
  auVar20._12_4_ = uVar192;
  local_12d8 = local_1348[2];
  dStack_12d0 = auVar20._8_8_;
  local_12b8 = local_1348[2] * 3.0;
  dStack_12b0 = local_1348[2];
  local_12a8 = local_1348[2];
  local_1348[2] = local_1348[2] * dVar166;
  local_1608[1] = local_1608[1] + dVar64 + local_1348[2];
  local_1608[0xb] = local_1608[0xb] + dVar64 + local_1348[2];
  local_1608[0xd] = (local_1608[0xd] - dVar64) - local_1348[2];
  lVar46 = 0;
  do {
    dVar63 = local_1348[lVar46];
    pdVar47[-0xc] = pdVar47[-0xc] + dVar63;
    pdVar47[-2] = pdVar47[-2] + dVar63;
    *pdVar47 = *pdVar47 - dVar63;
    lVar46 = lVar46 + 1;
    pdVar47 = pdVar47 + 0x16;
  } while (lVar46 != 0x15);
  dVar166 = dVar166 * (local_14e0 * 1303.7996080315893 +
                      (0.0031354148083023287 -
                      (((dStack_1420 + dStack_1470) - dStack_1410) + -1.0) * 0.0006666666666666666)
                      * -83.5827512505952 * local_14f0 * adStack_1550[2]);
  dVar126 = adStack_1550[1] * adStack_1550[3] * 1831069.794862108 +
            adStack_1550[2] * adStack_1550[5] * -1587014.959464585;
  dVar195 = adStack_1550[3] * 1831069.794862108;
  dStack_11e8 = dStack_11e8 - dVar195;
  dVar167 = adStack_1550[1] * adStack_1550[3] * 5835.198557030137 +
            (0.0031867701457385282 -
            ((dStack_1470 + local_1458) - (local_1478 + local_1468)) * 0.0006666666666666666) *
            -1587014.959464585 * adStack_1550[2] * adStack_1550[5];
  dVar196 = adStack_1550[5] * -1587014.959464585;
  dVar217 = adStack_1550[1] * 1831069.794862108;
  adStack_1150[0x17] = adStack_1150[0x17] - dVar217;
  dVar65 = adStack_1550[2] * -1587014.959464585;
  dVar248 = adStack_1550[5] * -0.44037520695372745;
  dVar197 = adStack_1550[4] * -0.44037520695372745;
  dVar66 = adStack_1550[3] * 20000000.0;
  local_dc8 = local_dc8 - dVar66;
  dVar67 = adStack_1550[7] * 20000000.0;
  dVar112 = adStack_1550[8] * 80000000.0;
  adStack_1150[0x1d] = adStack_1150[0x1d] - dVar67;
  adStack_1150[0x1e] = adStack_1150[0x1e] - dVar112;
  dVar127 = adStack_1550[3] * 80000000.0;
  local_d18 = local_d18 - dVar127;
  dVar128 = adStack_1550[2] * -2.787694465907913e-05;
  dVar300 = local_14e0 * -2.787694465907913e-05;
  dVar307 = local_14e0 * -1.2126178147109573e-07;
  dVar63 = (double)CONCAT44(uStack_1504,local_1508) * 15000000.0;
  adStack_1150[0x1f] = adStack_1150[0x1f] - dVar63;
  dVar68 = adStack_1550[3] * 15000000.0;
  local_c68 = local_c68 - dVar68;
  local_c10 = dVar68 + local_c10;
  dVar69 = adStack_1550[2] * -1.2126178147109573e-07;
  local_8c8 = local_8c8 - dVar69;
  dVar125 = local_14e0 * adStack_1550[2];
  dVar70 = dStack_14d8 * -0.12993945039280527;
  dVar71 = dStack_1500 * 84300000.0;
  dVar129 = adStack_1550[3] * 84300000.0;
  dVar163 = adStack_1550[2] * -0.12993945039280527;
  dVar130 = adStack_1550[3] * adStack_1550[7] * 20000000.0 +
            adStack_1550[5] * adStack_1550[4] * -0.44037520695372745;
  dVar155 = adStack_1550[3] * adStack_1550[8] * 80000000.0 + dVar125 * -2.787694465907913e-05;
  dVar249 = adStack_1550[3] * adStack_1550[7] * 0.0 +
            (0.0 - ((local_1458 + dStack_1460) - (local_1468 + local_1448)) * 0.0006666666666666666)
            * -0.44037520695372745 * adStack_1550[5] * adStack_1550[4];
  dVar257 = adStack_1550[3] * adStack_1550[8] * 0.0 +
            (0.0 - ((dStack_1410 + dStack_1470) - (local_1468 + dStack_1440)) *
                   0.0006666666666666666) * -2.787694465907913e-05 * dVar125;
  dVar60 = (local_388[0xd] - dVar166) + dVar257;
  auVar1._8_4_ = SUB84(local_388[0xe],0);
  auVar1._0_8_ = dVar60;
  auVar1._12_4_ = (int)((ulong)local_388[0xe] >> 0x20);
  dVar64 = adStack_1550[3] * (double)CONCAT44(uStack_1504,local_1508);
  dVar168 = dVar64 * 0.0 +
            (0.0 - ((dStack_1470 + dStack_1410) - (local_1468 + local_1438)) * 0.0006666666666666666
            ) * -1.2126178147109573e-07 * dVar125;
  dVar187 = dStack_1500 * adStack_1550[3] * 0.0 +
            (0.0 - ((dStack_1470 + local_1408) - (local_1468 + dStack_1430)) * 0.0006666666666666666
            ) * -0.12993945039280527 * adStack_1550[2] * dStack_14d8;
  dVar309 = dVar64 * 15000000.0 + dVar125 * -1.2126178147109573e-07;
  dVar314 = dStack_1500 * adStack_1550[3] * 84300000.0 +
            adStack_1550[2] * dStack_14d8 * -0.12993945039280527;
  dStack_1680 = auVar1._8_8_;
  dVar37 = adStack_1550[3] * dStack_14f8 * 3309407.0851908242 +
           adStack_1550[5] * dStack_1500 * -141857.17388911778;
  dVar64 = adStack_1550[3] * dStack_14f8 * 9674.740273245088 +
           (0.002923405922631374 -
           ((dStack_1430 + local_1458) - (local_1428 + local_1468)) * 0.0006666666666666666) *
           -141857.17388911778 * adStack_1550[5] * dStack_1500;
  dVar250 = dStack_1500 * -141857.17388911778;
  dVar238 = adStack_1550[5] * -141857.17388911778;
  dVar198 = adStack_1550[3] * 3309407.0851908242;
  local_b08 = local_b08 - dVar198;
  dVar131 = dStack_14f8 * 3309407.0851908242;
  dVar156 = local_14e0 * 30000000.0;
  adStack_1150[0x21] = adStack_1150[0x21] - dVar131;
  dVar72 = adStack_1550[5] * -1.316420144391347e-05;
  dVar73 = adStack_1550[3] * 30000000.0;
  dVar132 = adStack_1550[2] * -9.717850050148037e-07;
  local_950 = local_950 - dVar132;
  dStack_8a8 = dVar73 + dStack_8a8;
  dVar283 = local_14e0 * adStack_1550[3] * 0.0 +
            (0.0 - ((local_1458 + dStack_1420) - (dStack_1410 + local_1468)) * 0.0006666666666666666
            ) * -1.316420144391347e-05 * adStack_1550[5] * local_14f0;
  dVar289 = adStack_1550[3] * local_14e0 * 0.0 +
            (0.0 - ((local_1418 + dStack_1470) - (local_1468 + dStack_1410)) * 0.0006666666666666666
            ) * -9.717850050148037e-07 * adStack_1550[2] * dStack_14e8;
  dVar125 = local_14f0 * -1.316420144391347e-05;
  dVar317 = local_14e0 * adStack_1550[3] * 30000000.0 +
            adStack_1550[5] * local_14f0 * -1.316420144391347e-05;
  dVar320 = adStack_1550[3] * local_14e0 * 30000000.0 +
            adStack_1550[2] * dStack_14e8 * -9.717850050148037e-07;
  dVar74 = dStack_14e8 * -9.717850050148037e-07;
  dVar284 = local_14e0 * 30000000.0;
  dVar290 = dStack_14d8 * 11893241.704910735;
  dVar239 = dStack_14d8 * adStack_1550[3] * 11893241.704910735 +
            adStack_1550[5] * local_14e0 * -2811.709768791155;
  dVar267 = local_14e0 * -2811.709768791155;
  dVar133 = adStack_1550[5] * -2811.709768791155;
  dVar75 = adStack_1550[3] * 11893241.704910735;
  dVar76 = dStack_1500 * -14.898178128775022;
  local_8f8 = (((((local_8f8 - dVar128) - dVar69) - dVar73) - dVar73) - dVar133) - dVar76;
  local_888 = local_888 - dVar76;
  dVar77 = adStack_1550[3] * 11574309.207109384;
  local_6e8 = local_6e8 - dVar77;
  local_690 = local_690 + dVar77;
  dVar218 = local_14c8 * 11574309.207109384;
  dVar231 = dStack_14c0 * 132000000.0;
  local_1018 = local_1018 - dVar218;
  dVar59 = ((dVar71 + (double)local_1030._8_8_) - dVar290) + dVar231;
  local_1030._8_4_ = SUB84(dVar59,0);
  local_1030._0_8_ =
       (((dVar63 + (double)local_1030._0_8_ + dVar112) - dVar156) - dVar284) + dVar290 + dVar218;
  local_1030._12_4_ = (int)((ulong)dVar59 >> 0x20);
  dVar219 = local_14e0 * -14.898178128775022;
  dVar232 = dStack_14d8 * -0.00037751521951089154;
  dVar59 = dVar129 + dStack_b58 + dVar232;
  auVar2._8_4_ = SUB84(dVar59,0);
  auVar2._0_8_ = local_b60 + dVar219;
  auVar2._12_4_ = (int)((ulong)dVar59 >> 0x20);
  auVar3._8_4_ = SUB84(dStack_b40 - dVar232,0);
  auVar3._0_8_ = local_b48 - dVar219;
  auVar3._12_4_ = (int)((ulong)(dStack_b40 - dVar232) >> 0x20);
  dVar59 = dStack_1500 * -0.00037751521951089154;
  local_848 = ((local_848 - dVar163) - dVar75) - dVar59;
  local_7d0 = local_7d0 - dVar59;
  dVar61 = adStack_1550[3] * 132000000.0;
  local_5d8 = local_5d8 + dVar61;
  dVar301 = dStack_14d8 * adStack_1550[3] * 9416.207166531589 +
            (0.0007917275541994261 -
            ((local_1458 + dStack_1410) - (local_1468 + local_1408)) * 0.0006666666666666666) *
            -2811.709768791155 * adStack_1550[5] * local_14e0;
  dVar38 = adStack_1550[3] * local_14c8 * 14690.152683074684 +
           (0.0012692034073231281 -
           ((dStack_1430 + dStack_1410) - (local_1468 + local_13f8)) * 0.0006666666666666666) *
           -14.898178128775022 * dStack_1500 * local_14e0;
  dVar45 = adStack_1550[3] * dStack_14c0 * 0.0 +
           (0.0 - ((dStack_1430 + local_1408) - (local_1468 + dStack_13f0)) * 0.0006666666666666666)
           * -0.00037751521951089154 * dStack_1500 * dStack_14d8;
  dVar199 = adStack_1550[3] * local_14c8 * 11574309.207109384 +
            dStack_1500 * local_14e0 * -14.898178128775022;
  dVar212 = adStack_1550[3] * dStack_14c0 * 132000000.0 +
            dStack_1500 * dStack_14d8 * -0.00037751521951089154;
  dVar60 = (((dVar168 + dVar60) - dVar283) - dVar289) + dVar301 + dVar38;
  dVar62 = ((dVar187 + dStack_1680) - dVar301) + dVar45;
  auVar4._8_4_ = SUB84(dVar62,0);
  auVar4._0_8_ = dVar60;
  auVar4._12_4_ = (int)((ulong)dVar62 >> 0x20);
  local_388[0xe] = auVar4._8_8_;
  dVar302 = adStack_1550[3] * local_14b8 * 16686316.432824839 +
            dStack_14c0 * adStack_1550[5] * -64695.71318864056;
  dVar78 = adStack_1550[3] * local_14b8 * 42593.141495423035 +
           (0.00255257903485727 -
           ((dStack_13f0 + local_1458) - (local_13e8 + local_1468)) * 0.0006666666666666666) *
           -64695.71318864056 * dStack_14c0 * adStack_1550[5];
  dVar169 = dStack_14c0 * -64695.71318864056;
  dVar268 = adStack_1550[5] * -64695.71318864056;
  local_638 = (local_638 - dVar61) - dVar268;
  dVar62 = adStack_1550[3] * 16686316.432824839;
  local_588 = local_588 - dVar62;
  dVar134 = local_14f0 * 0.2714339464219018;
  local_f88 = dVar134 + local_f88;
  dVar79 = adStack_1550[4] * 0.2714339464219018;
  local_a58 = (local_a58 - dVar72) + dVar79;
  dVar80 = adStack_1550[3] * -0.32764529688590877;
  local_9a8 = (local_9a8 - dVar132) + dVar80;
  local_9a0 = local_9a0 - dVar80;
  dVar122 = dStack_14d8 * 148.64629960980085;
  dVar164 = adStack_1550[7] * -1595994.8383312945;
  dVar81 = adStack_1550[4] * 148.64629960980085;
  dVar200 = local_14f0 * adStack_1550[4] * 0.002901780483165377 +
            (0.01069055850020694 -
            ((local_1468 + local_1418) - (dStack_1460 + dStack_1420)) * 0.0006666666666666666) *
            -0.32764529688590877 * adStack_1550[3] * dStack_14e8;
  dVar213 = dStack_14d8 * adStack_1550[4] * 1.3298008048685055 +
            (0.008946074058750577 -
            ((dStack_1410 + local_1448) - (dStack_1460 + local_1408)) * 0.0006666666666666666) *
            -1595994.8383312945 * adStack_1550[7] * local_14e0;
  dVar82 = dStack_14e8 * -0.32764529688590877;
  dVar113 = local_14b8 * 16686316.432824839;
  local_1010 = (local_1010 - dVar231) + dVar113;
  local_1008 = local_1008 - dVar113;
  adStack_1150[0x22] = (dVar156 + adStack_1150[0x22]) - dVar82;
  adStack_1150[0x23] = dVar82 + adStack_1150[0x23] + dVar284;
  dVar269 = local_14f0 * adStack_1550[4] * 0.2714339464219018 +
            adStack_1550[3] * dStack_14e8 * -0.32764529688590877;
  dVar280 = dStack_14d8 * adStack_1550[4] * 148.64629960980085 +
            adStack_1550[7] * local_14e0 * -1595994.8383312945;
  dVar25 = dVar320 + local_1608[0xc] + dVar269;
  dVar165 = dVar199 + (((dVar309 + local_1608[0xd] + dVar155) - dVar317) - dVar320) + dVar239 +
            dVar280;
  auVar21._8_4_ = SUB84(dVar165,0);
  auVar21._0_8_ = dVar25;
  auVar21._12_4_ = (int)((ulong)dVar165 >> 0x20);
  local_1608[0xd] = auVar21._8_8_;
  dVar170 = local_14e0 * -1595994.8383312945;
  dVar240 = adStack_1550[5] * -10782603.17894348;
  dVar121 = ((dVar67 + adStack_1150[0x1a]) - dVar82) - dVar240;
  dVar165 = dVar67 + dVar217 + adStack_1150[0x1b] + dVar131 + dVar156 + dVar290 + dVar113 + dVar240;
  auVar22._8_4_ = SUB84(dVar165,0);
  auVar22._0_8_ = dVar121;
  auVar22._12_4_ = (int)((ulong)dVar165 >> 0x20);
  adStack_1150[0x18] =
       (adStack_1150[0x18] + dVar217 + dVar112 + dVar63 + dVar71 + dVar284) - dVar240;
  dVar135 = adStack_1550[3] * -10782603.17894348;
  dVar292 = adStack_1550[1] * -0.4971315070618765;
  dVar297 = adStack_1550[2] * 659416.0587695736;
  dVar39 = adStack_1550[4] * -0.4971315070618765;
  local_11e0 = local_11e0 + dVar39;
  local_11c8 = local_11c8 - dVar39;
  dVar83 = adStack_1550[7] * 19568365.243600544;
  dVar114 = adStack_1550[4] * 659416.0587695736;
  adStack_1150[3] =
       (((((adStack_1150[3] - dVar196) - dVar300) - dVar307) - dVar70) - dVar74) + dVar114;
  dVar84 = adStack_1550[4] * adStack_1550[2] * 659416.0587695736 +
           adStack_1550[3] * adStack_1550[5] * -10782603.17894348;
  dVar26 = adStack_1550[4] * adStack_1550[2] * 2125.623798113147 +
           (0.0032234941352193023 -
           ((local_1468 + local_1458) - (dStack_1470 + dStack_1460)) * 0.0006666666666666666) *
           -10782603.17894348 * adStack_1550[3] * adStack_1550[5];
  dVar85 = adStack_1550[2] * adStack_1550[7] * 19568365.243600544 +
           adStack_1550[1] * adStack_1550[4] * -0.4971315070618765;
  dVar270 = adStack_1550[2] * adStack_1550[7] * 4674.103192900765 +
            adStack_1550[1] * adStack_1550[4] *
            (0.00023886017736864045 -
            ((dStack_1460 + local_1478) - (dStack_1470 + local_1448)) * 0.0006666666666666666) *
            -0.4971315070618765;
  local_fe8 = local_fe8 + dVar292;
  dVar171 = adStack_1550[2] * 19568365.243600544;
  local_dd8 = local_dd8 + dVar171;
  dVar271 = adStack_1550[7] * adStack_1550[2] * 108289848.15442011 +
            adStack_1550[5] * adStack_1550[5] * -38.98923487337139;
  dVar40 = adStack_1550[7] * adStack_1550[2] * 15379.207897229715 +
           (0.00014201892568266544 -
           ((local_1458 + local_1458) - (local_1448 + dStack_1470)) * 0.0006666666666666666) *
           -38.98923487337139 * adStack_1550[5] * adStack_1550[5];
  dVar201 = adStack_1550[7] * 108289848.15442011;
  dVar86 = adStack_1550[5] * -77.97846974674277;
  adStack_1150[7] = (adStack_1150[7] - dVar83) - dVar201;
  dVar172 = adStack_1550[2] * 108289848.15442011;
  local_dd0 = (local_dd0 - dVar171) - dVar172;
  dVar87 = adStack_1550[1] * -120140.80184495587;
  dVar88 = adStack_1550[2] * 2429212.6664140443;
  local_b18 = local_b18 + dVar88;
  local_b10 = local_b10 - dVar88;
  dVar89 = adStack_1550[2] * dStack_14f8 * 8512.899029058015 +
           (0.003504386069921407 -
           ((dStack_1430 + local_1478) - (dStack_1470 + local_1428)) * 0.0006666666666666666) *
           -120140.80184495587 * adStack_1550[1] * dStack_1500;
  dVar115 = local_14e0 * adStack_1550[2] * 0.0 +
            (0.0 - ((dStack_1420 + local_1478) - (dStack_1410 + dStack_1470)) *
                   0.0006666666666666666) * -3.716149717925534e-05 * local_14f0 * adStack_1550[1];
  dVar293 = dStack_1500 * -120140.80184495587;
  dVar298 = local_14f0 * -3.716149717925534e-05;
  local_11a8 = local_11a8 - dVar293;
  dStack_11a0 = dVar298 + dStack_11a0;
  dVar202 = dStack_14f8 * 2429212.6664140443;
  dVar214 = local_14e0 * 73400000.0;
  adStack_1150[0xb] = adStack_1150[0xb] - dVar202;
  dVar173 = adStack_1550[1] * -3.716149717925534e-05;
  local_a68 = local_a68 + dVar173;
  dVar318 = adStack_1550[2] * 73400000.0;
  dVar251 = adStack_1550[2] * dStack_14f8 * 2429212.6664140443 +
            adStack_1550[1] * dStack_1500 * -120140.80184495587;
  dVar258 = local_14e0 * adStack_1550[2] * 73400000.0 +
            local_14f0 * adStack_1550[1] * -3.716149717925534e-05;
  dVar41 = adStack_1550[2] * dStack_14d8 * 16575581.576889673 +
           local_14e0 * adStack_1550[1] * -4521.295558798051;
  dVar136 = adStack_1550[2] * dStack_14d8 * 23743.85449528333 +
            (0.0014324598135602037 -
            ((dStack_1410 + local_1478) - (dStack_1470 + local_1408)) * 0.0006666666666666666) *
            -4521.295558798051 * local_14e0 * adStack_1550[1];
  dVar220 = local_14e0 * -4521.295558798051;
  local_1190 = (local_1190 - dVar298) + dVar220;
  local_1188 = local_1188 - dVar220;
  dVar272 = dStack_14d8 * 16575581.576889673;
  adStack_1150[0xe] = (((dVar307 + adStack_1150[0xe] + dVar300) - dVar74) - dVar214) + dVar272;
  dVar303 = adStack_1550[1] * -4521.295558798051;
  local_908 = local_908 + dVar318 + dVar303;
  local_900 = ((local_900 + dVar128 + dVar69 + dVar73) - dVar318) - dVar303;
  dVar90 = adStack_1550[2] * 16575581.576889673;
  local_858 = local_858 + dVar90;
  dVar27 = adStack_1550[2] * local_14d0 * 32000000.0 +
           adStack_1550[5] * dStack_1500 * -10291.734087429853;
  dVar203 = adStack_1550[2] * local_14d0 * 0.0 +
            (0.0 - ((local_1458 + dStack_1430) - (dStack_1470 + dStack_1400)) *
                   0.0006666666666666666) * -10291.734087429853 * adStack_1550[5] * dStack_1500;
  dVar221 = local_14d0 * 32000000.0;
  adStack_1150[0x10] = adStack_1150[0x10] - dVar221;
  dVar174 = dStack_1500 * -10291.734087429853;
  dVar91 = adStack_1550[5] * -10291.734087429853;
  dVar165 = adStack_1550[2] * 32000000.0;
  local_7a0 = local_7a0 - dVar165;
  dVar28 = adStack_1550[2] * local_14b8 * 9958163.265843963 +
           adStack_1550[1] * dStack_14c0 * -44546.96801065157;
  dVar175 = adStack_1550[2] * local_14b8 * 29384.200706874846 +
            (0.0029507651082264627 -
            ((local_1478 + dStack_13f0) - (dStack_1470 + local_13e8)) * 0.0006666666666666666) *
            -44546.96801065157 * adStack_1550[1] * dStack_14c0;
  dVar222 = dStack_14c0 * -44546.96801065157;
  local_1170 = local_1170 + dVar222;
  local_1168[0] = local_1168[0] - dVar222;
  dVar216 = local_14b8 * 9958163.265843963;
  adStack_1150[0x13] = adStack_1150[0x13] - dVar216;
  dVar92 = adStack_1550[1] * -44546.96801065157;
  local_648 = local_648 + dVar92;
  dVar137 = adStack_1550[2] * 9958163.265843963;
  local_598 = local_598 + dVar137;
  local_590 = local_590 - dVar137;
  dVar252 = adStack_1550[1] * adStack_1550[5] * 4271828.084344627 +
            adStack_1550[2] * adStack_1550[6] * -121922.904977942;
  dVar223 = adStack_1550[1] * adStack_1550[5] * 7577.3366907946565 +
            (0.0017737925172045287 -
            ((dStack_1470 + dStack_1450) - (local_1478 + local_1458)) * 0.0006666666666666666) *
            -121922.904977942 * adStack_1550[2] * adStack_1550[6];
  dVar176 = adStack_1550[5] * 34296205.4093863;
  local_1698 = (double)CONCAT44(uStack_1504,local_1508);
  local_1678 = (double)CONCAT44(uStack_1504,local_1508);
  dVar294 = adStack_1550[5] * 4271828.084344627;
  local_11d8 = (dVar195 + local_11d8) - dVar294;
  local_11d0 = dVar294 + local_11d0;
  dVar124 = adStack_1550[6] * -121922.904977942;
  adStack_1150[6] = dVar124 + adStack_1150[6];
  dVar241 = adStack_1550[1] * 4271828.084344627;
  local_f38 = (local_f38 - dVar65) - dVar241;
  dVar138 = adStack_1550[2] * -121922.904977942;
  local_e88 = local_e88 - dVar138;
  local_e80 = local_e80 + dVar138;
  dVar237 = adStack_1550[6] * -100069.45216403608;
  adStack_1150[0x1b] = auVar22._8_8_;
  adStack_1150[0x1c] = dVar237 + adStack_1150[0x1c];
  dVar247 = adStack_1550[6] * -0.024867627282709664;
  dVar299 = dVar247 + dVar292 + ((((dVar248 + dStack_fd0) - dVar134) - dVar122) - dVar297);
  dVar308 = (dVar297 + dVar248 + dStack_fc8) - dVar247;
  auVar23._8_4_ = SUB84(dVar308,0);
  auVar23._0_8_ = dVar299;
  auVar23._12_4_ = (int)((ulong)dVar308 >> 0x20);
  dVar153 = adStack_1550[3] * -100069.45216403608;
  dVar211 = adStack_1550[4] * -0.024867627282709664;
  local_e78 = local_e78 + dVar153;
  local_e58 = local_e58 - dVar211;
  dVar177 = dVar176 + ((dVar66 + local_dc0) - dVar170) + dVar171;
  dVar308 = (dVar172 + dVar172 + dVar66 + dStack_db8) - dVar176;
  local_db0 = local_db0 + dVar176;
  auVar33._8_4_ = SUB84(dVar308,0);
  auVar33._0_8_ = dVar177;
  auVar33._12_4_ = (int)((ulong)dVar308 >> 0x20);
  dVar178 = adStack_1550[7] * 34296205.4093863;
  dStack_1360 = adStack_1550[8] * 20000000.0;
  local_1698 = local_1698 * 30000000.0;
  dVar315 = adStack_1550[5] * 6077655.854054699;
  dVar316 = dStack_14d8 * adStack_1550[2];
  dVar93 = adStack_1550[5] * adStack_1550[7] * 34296205.4093863 +
           adStack_1550[4] * adStack_1550[6] * -0.024867627282709664;
  dVar116 = adStack_1550[5] * adStack_1550[8] * 20000000.0 + dVar316 * -0.029479148639814108;
  dVar304 = adStack_1550[5] * 20000000.0;
  dVar285 = adStack_1550[5] * local_1678 * 30000000.0 + dVar316 * -0.001025849604117461;
  dVar291 = adStack_1550[5] * adStack_1550[5] * 3038827.9270273494 +
            adStack_1550[6] * adStack_1550[3] * -100069.45216403608;
  dVar139 = dStack_14d8 * -0.029479148639814108;
  dVar157 = dStack_14d8 * -0.001025849604117461;
  adStack_1150[0xf] = dVar157 + ((dVar70 + adStack_1150[0xf]) - dVar272) + dVar139;
  dVar245 = ((((local_f30 + dVar65) - dVar135) - dVar86) - dVar174) + dVar241 + dStack_1360 +
            local_1698;
  dVar308 = dVar135 + ((((((dStack_f28 - dVar65) - dVar197) - dVar250) - dVar125) - dVar267) -
                      dVar169) + dVar315;
  auVar34._8_4_ = SUB84(dVar308,0);
  auVar34._0_8_ = dVar245;
  auVar34._12_4_ = (int)((ulong)dVar308 >> 0x20);
  dVar154 = adStack_1550[5] * 30000000.0;
  dVar29 = adStack_1550[2] * -0.029479148639814108;
  dVar32 = adStack_1550[2] * -0.001025849604117461;
  local_850 = ((local_850 + dVar163) - dVar90) + dVar29 + dVar32;
  dVar204 = adStack_1550[5] * adStack_1550[7] * -3835.2049190811504 +
            (-0.00011182592573438223 -
            ((dStack_1450 + dStack_1460) - (local_1458 + local_1448)) * 0.0006666666666666666) *
            -0.024867627282709664 * adStack_1550[4] * adStack_1550[6];
  dVar215 = adStack_1550[5] * adStack_1550[8] * 0.0 +
            (0.0 - ((local_1408 + dStack_1470) - (local_1458 + dStack_1440)) * 0.0006666666666666666
            ) * -0.029479148639814108 * dVar316;
  dVar273 = adStack_1550[5] * local_1678 * 0.0 +
            (0.0 - ((local_1408 + dStack_1470) - (local_1438 + local_1458)) * 0.0006666666666666666)
            * -0.001025849604117461 * dVar316;
  dVar281 = adStack_1550[5] * adStack_1550[5] * 3428.0853547552383 +
            (0.0011280945934009068 -
            ((dStack_1450 + local_1468) - (local_1458 + local_1458)) * 0.0006666666666666666) *
            -100069.45216403608 * adStack_1550[6] * adStack_1550[3];
  dVar94 = adStack_1550[6] * -37781.99143773652;
  local_d00 = local_d00 + dVar94;
  dVar140 = dStack_1500 * 1097137.153737377;
  dVar158 = dStack_1500 * 25010000.0;
  dVar308 = (dStack_f00 - dStack_1360) + dVar140;
  dVar316 = (local_ef8 - local_1698) + dVar158;
  auVar5._8_4_ = SUB84(dVar316,0);
  auVar5._0_8_ = dVar308;
  auVar5._12_4_ = (int)((ulong)dVar316 >> 0x20);
  dVar316 = adStack_1550[6] * (double)CONCAT44(uStack_1504,local_1508);
  dVar141 = adStack_1550[8] * -37781.99143773652;
  dVar159 = (double)CONCAT44(uStack_1504,local_1508) * -37124457.44676649;
  auVar6._8_4_ = SUB84(dStack_e48 + dVar159,0);
  auVar6._0_8_ = local_e50 + dVar141;
  auVar6._12_4_ = (int)((ulong)(dStack_e48 + dVar159) >> 0x20);
  dVar142 = adStack_1550[6] * -37124457.44676649;
  dVar143 = adStack_1550[5] * 1097137.153737377;
  dVar160 = adStack_1550[5] * 25010000.0;
  auVar7._8_4_ = SUB84(dStack_b88 + dVar160,0);
  auVar7._0_8_ = local_b90 + dVar143;
  auVar7._12_4_ = (int)((ulong)(dStack_b88 + dVar160) >> 0x20);
  dVar224 = dStack_1500 * adStack_1550[5] * 1097137.153737377 +
            adStack_1550[6] * adStack_1550[8] * -37781.99143773652;
  dVar233 = adStack_1550[5] * dStack_1500 * 25010000.0 + dVar316 * -37124457.44676649;
  dVar95 = dStack_1500 * adStack_1550[5] * 2500.221646810261 +
           (0.00227885970162737 -
           ((dStack_1450 + dStack_1440) - (dStack_1430 + local_1458)) * 0.0006666666666666666) *
           -37781.99143773652 * adStack_1550[6] * adStack_1550[8];
  dVar117 = adStack_1550[5] * dStack_1500 * 0.0 +
            (0.0 - ((dStack_1450 + local_1438) - (local_1458 + dStack_1430)) * 0.0006666666666666666
            ) * -37124457.44676649 * dVar316;
  local_1398 = dVar117 + ((local_388[8] - dVar168) - dVar273);
  dVar144 = adStack_1550[5] * dStack_14f8 * 4238127.66170656 +
            adStack_1550[6] * dStack_1500 * -5982.3326554224905;
  dVar316 = adStack_1550[5] * dStack_14f8 * 7478.008612521503 +
            (0.0017644604432492119 -
            ((dStack_1430 + dStack_1450) - (local_1428 + local_1458)) * 0.0006666666666666666) *
            -5982.3326554224905 * adStack_1550[6] * dStack_1500;
  dVar96 = dStack_14f8 * 4238127.66170656;
  local_ee8 = (local_ee8 - dVar250) - dVar96;
  dVar305 = dStack_1500 * -5982.3326554224905;
  local_e40 = ((local_e40 - dVar141) - dVar159) + dVar305;
  local_e38 = local_e38 - dVar305;
  dVar30 = adStack_1550[6] * -5982.3326554224905;
  local_ba0 = local_ba0 + dVar143 + dVar160 + dVar30;
  dVar179 = adStack_1550[5] * 4238127.66170656;
  local_af8 = (local_af8 + dVar198) - dVar179;
  local_af0 = local_af0 + dVar179;
  dVar205 = adStack_1550[2] * -27278.71839873273;
  local_9b0 = local_9b0 + dVar132 + dVar205;
  dVar225 = local_14f0 * -7.225013822780462e-07;
  dVar226 = adStack_1550[5] * 369528.79729527823;
  dVar234 = adStack_1550[6] * -7.225013822780462e-07;
  dVar145 = adStack_1550[5] * 50000000.0;
  dVar146 = dStack_14e8 * -27278.71839873273;
  adStack_1150[0xd] = dVar146 + adStack_1150[0xd] + dVar74;
  dVar180 = local_14e0 * 50000000.0;
  dVar188 = local_14f0 * 369528.79729527823;
  dStack_f28 = auVar34._8_8_;
  dVar319 = dStack_14d8 * 22295026.02480445;
  dVar274 = local_14e0 * -173.56959160214726;
  local_e20 = (local_e20 - dVar225) + dVar274;
  local_e18 = local_e18 - dVar274;
  dVar42 = adStack_1550[6] * -173.56959160214726;
  local_8e0 = local_8e0 + dVar145 + dVar42;
  dVar253 = adStack_1550[5] * 22295026.02480445;
  local_830 = local_830 + dVar253;
  dVar227 = adStack_1550[5] * local_14e0 * 50000000.0 +
            adStack_1550[6] * local_14f0 * -7.225013822780462e-07;
  dVar235 = adStack_1550[5] * local_14f0 * 369528.79729527823 +
            adStack_1550[2] * dStack_14e8 * -27278.71839873273;
  dVar43 = ((dVar258 + ((dVar317 + local_1608[0xb]) - dVar269)) - dVar235) + dVar227;
  dVar25 = dVar25 + dVar235;
  auVar35._8_4_ = SUB84(dVar25,0);
  auVar35._0_8_ = dVar43;
  auVar35._12_4_ = (int)((ulong)dVar25 >> 0x20);
  local_1608[0xc] = auVar35._8_8_;
  dVar31 = adStack_1550[5] * dStack_14d8 * 22295026.02480445 +
           adStack_1550[6] * local_14e0 * -173.56959160214726;
  dVar147 = adStack_1550[5] * local_14e0 * 0.0 +
            (0.0 - ((dStack_1450 + dStack_1420) - (dStack_1410 + local_1458)) *
                   0.0006666666666666666) * -7.225013822780462e-07 * adStack_1550[6] * local_14f0;
  dVar161 = adStack_1550[5] * local_14f0 * 308.3061146970958 +
            (0.0008343222962694802 -
            ((dStack_1470 + local_1418) - (dStack_1420 + local_1458)) * 0.0006666666666666666) *
            -27278.71839873273 * adStack_1550[2] * dStack_14e8;
  local_1378 = local_388[0xc] + dVar289 + dVar200 + dVar161;
  dVar242 = adStack_1550[5] * dStack_14d8 * 15309.867045680163 +
            (0.0006866942890601289 -
            ((dStack_1450 + dStack_1410) - (local_1458 + local_1408)) * 0.0006666666666666666) *
            -173.56959160214726 * adStack_1550[6] * local_14e0;
  dStack_1370 = ((((dVar60 + dVar213) - dVar115) + dVar136) - dVar147) + dVar242;
  dVar97 = local_14b8 * 14307411.985466668;
  local_f10 = dVar315 + dVar241 + local_f10 + dVar178 + dVar140 + dVar158 + dVar96 + dVar180 +
              dVar319 + dVar97;
  local_eb0 = local_eb0 + dVar169 + dVar97;
  local_ea8 = (local_ea8 - dVar169) - dVar97;
  dVar98 = dStack_14c0 * -1826.7180743084757;
  local_e68 = ((((((((local_e68 - dVar138) - (dVar153 + dVar153)) - dVar211) - dVar141) - dVar159) -
                dVar305) - dVar225) - dVar274) - dVar98;
  local_e00 = local_e00 + dVar98;
  local_df8 = local_df8 - dVar98;
  dVar206 = adStack_1550[6] * -1826.7180743084757;
  local_628 = (local_628 + dVar268) - dVar206;
  local_620 = local_620 + dVar206;
  dVar99 = adStack_1550[5] * -1.061382456225949e-08;
  dStack_820 = (dStack_820 - dVar29) - dVar99;
  dVar100 = dStack_14f8 * -0.5136789314491079;
  dStack_fc8 = auVar23._8_8_;
  local_f98 = dVar100 + local_f98;
  dStack_1390 = local_14d0;
  dVar181 = dStack_14d8 * -1.061382456225949e-08;
  dVar189 = local_14d0 * -22389.705712050265;
  dStack_db8 = auVar33._8_8_;
  local_ef8 = auVar5._8_8_;
  dStack_ec0 = (dStack_ec0 - dVar174) + dVar189;
  dVar101 = adStack_1550[7] * 1000000.0;
  dVar118 = adStack_1550[7] * 20000000.0;
  local_b98 = (local_b98 - dVar101) - dVar118;
  dVar102 = adStack_1550[5] * -22389.705712050265;
  local_788 = local_788 + dVar165 + dVar102;
  uStack_13c0 = 0;
  dVar182 = local_14b8 * adStack_1550[5] * 23005.037159633022 +
            (0.0016079104441111584 -
            ((dStack_13f0 + dStack_1450) - (local_13e8 + local_1458)) * 0.0006666666666666666) *
            -1826.7180743084757 * adStack_1550[6] * dStack_14c0;
  dVar148 = adStack_1550[5] * 14307411.985466668;
  local_578 = (local_578 + dVar62) - dVar148;
  local_570 = local_570 + dVar148;
  dVar275 = dStack_1500 * 20000000.0;
  dVar60 = adStack_1550[7] * 20000000.0;
  local_cf8 = local_cf8 - dVar60;
  local_cb8 = dVar60 + dVar304 + local_cb8;
  dVar149 = dStack_1500 * 1000000.0;
  dVar162 = adStack_1550[8] * 20000000.0;
  local_da0 = local_da0 - dVar162;
  local_d88 = local_d88 + dVar149;
  dVar103 = adStack_1550[4] * -0.5136789314491079;
  local_b00 = local_b00 + dVar103;
  local_ae8 = local_ae8 - dVar103;
  dVar104 = adStack_1550[7] * adStack_1550[8] * 20000000.0 +
            dStack_14d8 * adStack_1550[5] * -1.061382456225949e-08;
  dVar119 = local_14b8 * adStack_1550[5] * 14307411.985466668 +
            adStack_1550[6] * dStack_14c0 * -1826.7180743084757;
  dVar207 = adStack_1550[7] * dStack_1500 * 20000000.0 +
            local_14d0 * adStack_1550[5] * -22389.705712050265;
  dStack_13a0 = dStack_1500 * adStack_1550[7] * 1000000.0 +
                dStack_14f8 * adStack_1550[4] * -0.5136789314491079;
  dVar25 = ((((((local_1608[6] - dVar130) + dVar280) - dVar85) - dVar271) - dVar93) - dVar104) -
           dStack_13a0;
  dVar16 = (dVar224 + ((local_1608[7] - dVar155) - dVar116)) - dVar104;
  auVar8._8_4_ = SUB84(dVar16,0);
  auVar8._0_8_ = dVar25;
  auVar8._12_4_ = (int)((ulong)dVar16 >> 0x20);
  local_1608[7] = auVar8._8_8_;
  local_d90 = (local_d90 - dVar149) - dVar275;
  dVar16 = local_14f0 * 54659.06262097068;
  local_d78 = dVar16 + local_d78;
  dVar105 = adStack_1550[7] * 54659.06262097068;
  dVar183 = adStack_1550[5] * -0.001452763170659347;
  local_998 = (local_998 - dVar205) + dVar183;
  local_988 = local_988 - dVar183;
  dVar184 = adStack_1550[8] * 7980492.798776164;
  local_fb0 = local_fb0 - dVar184;
  dVar276 = dStack_14e8 * -0.001452763170659347;
  dVar282 = local_14e0 * -4.547251755334367e-05;
  uStack_13b0 = 0;
  dVar208 = adStack_1550[4] * adStack_1550[8] * 2677.2779851191463 +
            (0.00033547777720314666 -
            ((dStack_1410 + local_1458) - (dStack_1440 + dStack_1460)) * 0.0006666666666666666) *
            -4.547251755334367e-05 * local_14e0 * adStack_1550[5];
  local_f08 = (((((local_f08 - dVar197) - dVar86) - dVar178) - dVar181) - dVar189) - dVar276;
  dVar150 = adStack_1550[4] * 7980492.798776164;
  dVar254 = adStack_1550[5] * -4.547251755334367e-05;
  dVar228 = dStack_1500 * adStack_1550[7] * 0.0 +
            (0.0 - ((dStack_1460 + local_1428) - (local_1448 + dStack_1430)) * 0.0006666666666666666
            ) * -0.5136789314491079 * dStack_14f8 * adStack_1550[4];
  dVar236 = adStack_1550[7] * adStack_1550[8] * 0.0 +
            (0.0 - ((local_1458 + local_1408) - (local_1448 + dStack_1440)) * 0.0006666666666666666)
            * -1.061382456225949e-08 * dStack_14d8 * adStack_1550[5];
  dStack_1240 = local_388[0xf] - dVar203;
  local_1208 = (((local_388[10] - dVar64) - dVar89) - dVar316) + dVar228;
  local_f8 = local_14a8;
  uStack_f0 = 0;
  dVar120 = dStack_14e8 * adStack_1550[5];
  auVar9._8_4_ = SUB84(adStack_1550[8] * local_14a8,0);
  auVar9._0_8_ = dVar120;
  auVar9._12_4_ = (int)((ulong)(adStack_1550[8] * local_14a8) >> 0x20);
  dStack_2c0 = local_13d8;
  dStack_ed8 = dStack_ed8 + dVar188 + dVar276;
  local_ed0 = (((local_ed0 - dVar125) + dVar267) - dVar180) + dVar319 + dVar282;
  local_d10 = local_d10 - dVar150;
  local_d08 = ((local_d08 - dVar304) - dVar94) + dVar60 + dVar150;
  local_cc0 = dVar150 + dVar127 + local_cc0;
  local_8e8 = (((local_8e8 + dVar73 + dVar133) - dVar145) - dVar42) + dVar254;
  local_8d0 = (local_8d0 - dVar128) - dVar254;
  local_288 = adStack_1550[2];
  dVar14 = adStack_1550[8] * adStack_1550[1] * 99487.69671959426 +
           adStack_1550[2] * dStack_1500 * -82454.99861437384;
  dVar44 = adStack_1550[8] * adStack_1550[1] * 293.5221550217246 +
           (0.0029503362194525 -
           ((dStack_1470 + dStack_1430) - (dStack_1440 + local_1478)) * 0.0006666666666666666) *
           -82454.99861437384 * adStack_1550[2] * dStack_1500;
  uStack_1380 = 0;
  local_1268 = local_14a8 * -170727.04371112576;
  uStack_1260 = 0;
  uStack_2d0 = 0;
  dStack_2b0 = local_14e0 * adStack_1550[5] * -4.547251755334367e-05;
  local_1238 = local_1438;
  dStack_1230 = dStack_1430;
  uStack_2a0 = 0;
  dVar110 = (double)CONCAT44(uStack_1504,local_1508);
  dStack_1220 = adStack_1550[8] * local_14b0;
  local_108 = dStack_14f8;
  uStack_100 = 0;
  dStack_1290 = local_14b0 * dVar110;
  dVar15 = adStack_1550[7] * dStack_1500 * 0.0 +
           local_14d0 * adStack_1550[5] *
           (0.0 - ((dStack_1400 + local_1458) - (dStack_1430 + local_1448)) * 0.0006666666666666666)
           * -22389.705712050265;
  dVar108 = dStack_1290 * 1645.8767818301812 +
            dStack_1220 *
            (0.00013419111088125866 -
            ((dStack_1440 + dStack_13e0) - (local_1438 + dStack_13e0)) * 0.0006666666666666666) *
            -284545.07285187626;
  auVar10._8_4_ = SUB84(dVar108,0);
  auVar10._0_8_ = dVar15;
  auVar10._12_4_ = (int)((ulong)dVar108 >> 0x20);
  dVar255 = adStack_1550[1] * 99487.69671959426;
  dVar106 = adStack_1550[8] * 99487.69671959426;
  local_11c0 = local_11c0 - dVar106;
  dVar310 = dStack_1500 * -82454.99861437384;
  local_e8 = 0.005278183694662841 -
             ((local_1458 + local_1418) - (dStack_1420 + local_1448)) * 0.0006666666666666666;
  dStack_e0 = 0.00013419111088125866 -
              ((dStack_1440 + local_13d8) - (local_1438 + local_13d8)) * 0.0006666666666666666;
  local_d28 = local_d28 - dVar255;
  dVar277 = adStack_1550[2] * -82454.99861437384;
  local_2c8 = (((local_bc0 + dVar129) - dVar87) - dVar91) + dVar277;
  local_1248 = (local_b90 + dVar143) - dVar277;
  local_1270 = dVar277 + ((((((dVar232 + (local_b80 - dVar129) + dVar238 + dVar219 + dVar87 + dVar91
                              ) - dVar143) - dVar160) + dVar30) - dVar101) - dVar118);
  dVar107 = adStack_1550[8] * dStack_1500 * 40000000.0 +
            adStack_1550[2] * local_14c8 * -10.82871927173647;
  dVar229 = adStack_1550[8] * dStack_1500 * 0.0 +
            (0.0 - ((dStack_1470 + local_13f8) - (dStack_1430 + dStack_1440)) *
                   0.0006666666666666666) * -10.82871927173647 * adStack_1550[2] * local_14c8;
  dVar286 = local_14c8 * -10.82871927173647;
  adStack_1150[8] = (((adStack_1150[8] - dVar300) - dVar139) - dVar310) - dVar286;
  dVar243 = dStack_1500 * 40000000.0;
  local_d20 = local_d20 + dVar127 + dVar304 + dVar255 + dVar243;
  local_ca8 = dVar243 + local_ca8;
  dVar151 = adStack_1550[2] * -10.82871927173647;
  local_6c0 = local_6c0 - dVar151;
  local_13a8 = 0.003182934144980015 -
               ((dStack_1430 + dStack_1430) - (dStack_1440 + local_1428)) * 0.0006666666666666666;
  dVar185 = dStack_14f8 * 345311.0578145205;
  local_ce0 = dVar185 + dVar185 + ((dVar255 + (local_ce0 - dVar94)) - dVar243);
  local_cd8 = local_cd8 - dVar185;
  dVar278 = adStack_1550[7] * local_14f0 * 54659.06262097068 + dVar120 * -0.001452763170659347;
  dStack_2b0 = adStack_1550[4] * adStack_1550[8] * 7980492.798776164 + dStack_2b0;
  dVar108 = (((local_1608[0xd] - dVar258) + dVar41) - dVar227) + dVar31 + dStack_2b0;
  auVar11._8_4_ = SUB84(dVar108,0);
  auVar11._0_8_ = local_1608[0xc] + dVar278;
  auVar11._12_4_ = (int)((ulong)dVar108 >> 0x20);
  dVar152 = dStack_1500 * -28308.253956378114;
  dVar311 = adStack_1550[8] * 40000000.0;
  dVar230 = adStack_1550[8] * 345311.0578145205;
  local_13b8 = dVar110 * 12265169.958139507 + adStack_1550[8] * -284545.07285187626;
  local_2b8 = local_ae0 - dVar230;
  local_1210 = (dVar103 + (((local_ac8 - dVar198) - dVar88) - dVar179)) - dVar230;
  local_2d8 = local_4a8;
  local_2a8 = local_4b0;
  adStack_1550[0] = auVar9._8_8_;
  local_1388 = local_14f0;
  dVar108 = adStack_1550[2] * adStack_1550[5] * local_14f0;
  dVar244 = dVar110 * local_14a8 * 7359101.974883704 + adStack_1550[0] * -170727.04371112576;
  dVar246 = adStack_1550[4] * dVar110 * 28000000.0 + dVar108 * -7.439703734094493e-10;
  dVar209 = dVar110 * 7359101.974883704 + adStack_1550[8] * -170727.04371112576;
  dStack_1280 = auVar11._8_8_;
  dVar186 = adStack_1550[7] * local_14f0 * 288.5005730915626 +
            local_e8 * -0.001452763170659347 * dVar120;
  dVar190 = dVar110 * local_14a8 * 987.5260690981088 +
            dStack_e0 * -170727.04371112576 * adStack_1550[0];
  dStack_b40 = auVar3._8_8_;
  dVar279 = dStack_14f8 * adStack_1550[8] * 1099.1023565570054 +
            local_13a8 * -14154.126978189057 * dStack_1500 * dStack_1500;
  dVar109 = dStack_14f8 * adStack_1550[8] * 345311.0578145205 +
            dStack_1500 * dStack_1500 * -14154.126978189057;
  dVar120 = dStack_1290 * 12265169.958139507 + dStack_1220 * -284545.07285187626;
  dStack_b88 = auVar7._8_8_;
  local_ae0 = local_ae0 - dVar230;
  local_4b0 = local_4b0 + local_13b8;
  local_4a8 = local_4a8 - local_13b8;
  dStack_1480 = auVar10._8_8_;
  local_400 = local_400 + dVar209;
  local_3f8 = local_3f8 - dVar209;
  dVar210 = ((((local_1608[7] - dStack_2b0) - dVar14) - dVar107) - dVar109) + dVar120 + dVar244;
  dVar120 = (((dVar233 + ((local_1608[8] - dVar309) - dVar285)) - dVar120) - dVar244) - dVar246;
  dVar244 = adStack_1550[4] * dVar110 * 0.0 +
            (0.0 - (((dStack_1470 + local_1458 + dStack_1420) - (local_1438 + dStack_1460)) + -1.0)
                   * 0.0006666666666666666) * -7.439703734094493e-10 * dVar108;
  auVar36._8_4_ = SUB84(dVar120,0);
  auVar36._0_8_ = dVar210;
  auVar36._12_4_ = (int)((ulong)dVar120 >> 0x20);
  local_1608[8] = auVar36._8_8_;
  dVar312 = adStack_1550[5] * -7.439703734094493e-10 * local_14f0;
  adStack_1150[4] = ((adStack_1150[4] - dVar114) + dVar83) - dVar312;
  adStack_1150[5] =
       (((((dVar201 + dVar201 + dVar196 + adStack_1150[5] + dVar114 + dVar221) - dVar124) - dVar139)
        - dVar157) - dVar146) + dVar312;
  adStack_1150[0xc] = dVar312 + ((dVar214 + adStack_1150[0xc]) - dVar146);
  dVar120 = (double)CONCAT44(uStack_1504,local_1508) * 28000000.0;
  local_fe0 = ((local_fe0 - dVar297) - dVar292) + dVar120;
  dVar295 = adStack_1550[2] * -7.439703734094493e-10 * local_14f0;
  local_f30 = dVar245 + dVar188 + dVar295;
  local_ef8 = local_ef8 - dVar295;
  dStack_f00 = (dVar308 - dVar181) - dVar282;
  local_ee0 = dVar295 + ((((local_ee0 + dVar125) - dVar188) + dVar180) - dVar276);
  dVar287 = adStack_1550[4] * 28000000.0;
  local_c58 = ((local_c58 - dVar154) - dVar142) + dVar287;
  dVar308 = adStack_1550[2] * -7.439703734094493e-10 * adStack_1550[5];
  local_a60 = (local_a60 - dVar173) + dVar226 + dVar308;
  local_a48 = (((local_a48 + dVar72) - dVar226) - dVar234) + dVar105 + dVar308;
  dVar108 = (double)CONCAT44(uStack_1504,local_1508) * adStack_1550[4];
  dVar306 = dVar108 * 12000000.0 + adStack_1550[6] * local_14f0 * -2.2921694105207742e-20;
  dVar209 = dVar108 * 0.0 +
            (0.0 - ((dStack_1450 + dStack_1420) - (dStack_1460 + local_1438)) *
                   0.0006666666666666666) * -2.2921694105207742e-20 * adStack_1550[6] * local_14f0;
  local_1608[5] =
       dVar31 + dVar291 + dVar252 + local_1608[5] + dVar93 + dVar224 + dVar233 + dVar144 + dVar227 +
       dVar119 + dVar306;
  dVar245 = (double)CONCAT44(uStack_1504,local_1508);
  dVar256 = dVar245 * 12000000.0;
  local_fc0 = local_fc0 + dVar247 + dVar256;
  local_fa8 = (local_fa8 - dVar120) - dVar256;
  dVar296 = local_14f0 * -2.2921694105207742e-20;
  dStack_e70 = (dStack_e70 + dVar211) - dVar296;
  local_e60 = dVar138 + local_e60 + dVar153 + dVar211 + dVar141 + dVar159 + dVar305 + dVar225 +
              dVar274 + dVar98 + dVar296;
  dStack_e48 = auVar6._8_8_;
  local_e30 = dVar296 + local_e30 + dVar225;
  dVar108 = adStack_1550[4] * 12000000.0;
  local_c60 = (local_c60 - dVar287) - dVar108;
  local_c50 = local_c50 + dVar142 + dVar108;
  dVar305 = adStack_1550[6] * -2.2921694105207742e-20;
  local_a40 = local_a40 + dVar234 + dVar305;
  local_388[5] = dVar281 + dVar223 + local_388[5] + dVar204 + dVar95 + dVar117 + dVar316 + dVar147 +
                 dVar242 + dVar182 + dVar209;
  dVar274 = adStack_1550[1] * dVar245 * 70000000.0 +
            adStack_1550[2] * dStack_1500 * -1345932.1015318723;
  local_1608[0] =
       ((((local_1608[0] - dVar126) + dVar85 + dVar251 + dVar258 + dVar41 + dVar28) - dVar252) -
       dVar14) - dVar274;
  dVar153 = dVar245 * 70000000.0;
  local_11f8 = ((((local_11f8 - dVar195) + dVar39 + dVar293 + dVar298 + dVar220 + dVar222) - dVar294
                ) - dVar106) - dVar153;
  local_11f0 = ((((((local_11f0 + dVar195) - dVar39) - dVar293) - dVar298) - dVar220) - dVar222) +
               dVar294 + dVar106 + dVar153;
  local_11b8 = local_11b8 - dVar153;
  local_11b0 = dVar153 + dVar106 + local_11b0 + dVar293;
  dVar110 = dStack_1500 * -1345932.1015318723;
  adStack_1150[1] =
       ((((adStack_1150[1] - dVar196) + dVar83 + dVar202 + dVar214 + dVar272 + dVar216) - dVar124) -
       dVar310) - dVar110;
  dVar293 = adStack_1550[1] * 70000000.0;
  local_c78 = local_c78 - dVar293;
  dVar159 = adStack_1550[1] * dVar245 * 0.0 +
            (0.0 - ((dStack_1470 + dStack_1430) - (local_1438 + local_1478)) * 0.0006666666666666666
            ) * -1345932.1015318723 * adStack_1550[2] * dStack_1500;
  dVar39 = adStack_1550[2] * -1345932.1015318723;
  local_bc8 = ((local_bc8 + dVar87) - dVar277) - dVar39;
  local_388[0] = ((((local_388[0] - dVar167) + dVar270 + dVar89 + dVar115 + dVar136 + dVar175) -
                  dVar223) - dVar44) - dVar159;
  dVar153 = (double)CONCAT44(uStack_1504,local_1508);
  dVar98 = adStack_1550[6] * dVar153 * 30000000.0 +
           adStack_1550[6] * adStack_1550[8] * -695983.1958864406;
  dVar195 = adStack_1550[6] * dVar153 * 0.0 +
            (0.0 - ((dStack_1450 + dStack_1440) - (dStack_1450 + local_1438)) *
                   0.0006666666666666666) * -695983.1958864406 * adStack_1550[6] * adStack_1550[8];
  dVar245 = dVar153 * 30000000.0 + adStack_1550[8] * -695983.1958864406;
  dStack_e48 = (dStack_e48 - dVar296) - dVar245;
  local_e50 = local_e50 + dVar141 + dVar245;
  dVar288 = dVar153 * dStack_1500 * 14528743.285075013 +
            adStack_1550[2] * local_14c8 * -0.09124785266815053;
  dVar222 = dVar153 * dStack_1500 * -1852.146791076201 +
            (-0.00012748155533719572 -
            ((dStack_1470 + local_13f8) - (local_1438 + dStack_1430)) * 0.0006666666666666666) *
            -0.09124785266815053 * adStack_1550[2] * local_14c8;
  dVar153 = local_14c8 * -0.09124785266815053;
  adStack_1150[9] = ((((adStack_1150[9] - dVar307) - dVar157) - dVar312) - dVar110) - dVar153;
  dVar245 = (dVar110 + ((dVar310 + (adStack_1150[10] - dVar70) + dVar202 + dVar221) - dVar286)) -
            dVar153;
  auVar24._8_4_ = SUB84(dVar245,0);
  auVar24._0_8_ = adStack_1150[9];
  auVar24._12_4_ = (int)((ulong)dVar245 >> 0x20);
  adStack_1150[0x11] = dVar153 + dVar286 + adStack_1150[0x11];
  dVar245 = dStack_1500 * 14528743.285075013;
  local_c70 = local_c70 + dVar68 + dVar154 + dVar287 + dVar293 + dVar245;
  local_bf8 = dVar245 + local_bf8;
  dVar138 = (double)CONCAT44(uStack_1504,local_1508);
  dVar296 = dVar138 * 14528743.285075013;
  dVar294 = adStack_1550[2] * -0.09124785266815053;
  local_6f0 = local_6f0 + dVar151 + dVar294;
  local_6b8 = local_6b8 - dVar294;
  dStack_6b0 = ((dStack_6b0 + dVar77) - dVar151) - dVar294;
  dVar298 = dVar138 * dStack_14f8 * 19371657.71343335 +
            dStack_1500 * dStack_1500 * -18421.156298117476;
  dVar220 = dVar138 * dStack_14f8 * -2469.529054768268 +
            (-0.00012748155533719572 -
            ((dStack_1430 + dStack_1430) - (local_1428 + local_1438)) * 0.0006666666666666666) *
            -18421.156298117476 * dStack_1500 * dStack_1500;
  dVar277 = dStack_1500 * -36842.31259623495;
  dStack_b88 = ((dStack_b88 - dVar39) - dVar296) - dVar277;
  local_b90 = (local_1248 - dVar311) - dVar152;
  dVar225 = dVar138 * 19371657.71343335;
  local_ad8 = local_ad8 - dVar225;
  dVar141 = (double)CONCAT44(uStack_1504,local_1508);
  dVar211 = dVar141 * 9000000.0 + adStack_1550[8] * -208794.958765932;
  local_a30 = local_a30 + dVar211;
  dVar106 = dVar141 * 7000000.0 + adStack_1550[8] * -162396.0790401699;
  local_980 = local_980 + dVar106;
  dVar313 = dStack_14d8 * -0.006485071999156734;
  local_a28 = (((local_a28 - dVar308) - dVar305) - dVar211) - dVar313;
  dStack_a08 = (dVar105 + dVar226 + dVar79 + dStack_a08) - dVar313;
  local_9f8 = dVar313 + local_9f8;
  dVar211 = (double)CONCAT44(uStack_1504,local_1508) * 14000000.0;
  local_978 = (local_978 - dVar106) - dVar211;
  local_960 = (((local_960 - dVar80) - dVar205) - dVar183) + dVar211;
  local_958 = (dVar183 + dVar205 + dVar80 + local_958 + dVar132) - dVar211;
  local_948 = dVar211 + local_948;
  dVar132 = local_14f0 * -0.006485071999156734;
  dStack_818 = (dStack_818 - dVar32) - dVar132;
  local_800 = local_800 + dVar132;
  local_7f8 = local_7f8 - dVar132;
  dVar211 = dVar138 * local_14f0 * 9000000.0 + local_14f0 * adStack_1550[8] * -208794.958765932;
  dVar183 = dVar138 * local_14f0 * 0.0 +
            (0.0 - ((dStack_1420 + dStack_1440) - (local_1438 + dStack_1420)) *
                   0.0006666666666666666) * -208794.958765932 * local_14f0 * adStack_1550[8];
  dStack_cf0 = ((((((((dStack_cf0 - dVar127) - dVar304) + dVar94) - dVar60) - dVar150) - dVar255) -
                dVar243) - dVar185) + local_14b0 * -284545.07285187626 + local_1268 +
               adStack_1550[6] * -695983.1958864406 + local_14f0 * -208794.958765932 +
               dStack_14e8 * -162396.0790401699;
  local_ce8 = ((((local_ce8 - local_14b0 * -284545.07285187626) - local_1268) -
               adStack_1550[6] * -695983.1958864406) - local_14f0 * -208794.958765932) -
              dStack_14e8 * -162396.0790401699;
  dVar141 = dVar141 * dStack_14e8;
  local_c40 = adStack_1550[6] * 30000000.0 +
              local_14b0 * 12265169.958139507 + local_c40 + local_14a8 * 7359101.974883704 +
              local_14f0 * 9000000.0 + dStack_14e8 * 7000000.0;
  dVar80 = dVar141 * 0.0 +
           (0.0 - ((local_1408 + dStack_1420) - (local_1418 + local_1438)) * 0.0006666666666666666)
           * -0.006485071999156734 * dStack_14d8 * local_14f0;
  dVar138 = dVar141 * 0.0 +
            (0.0 - ((dStack_1440 + local_1418) - (local_1418 + local_1438)) * 0.0006666666666666666)
            * -162396.0790401699 * adStack_1550[8] * dStack_14e8;
  dVar106 = dVar141 * 14000000.0 + dStack_14d8 * local_14f0 * -0.006485071999156734;
  dVar60 = dVar141 * 7000000.0 + adStack_1550[8] * dStack_14e8 * -162396.0790401699;
  local_1608[7] = dVar98 + dVar210 + dVar211 + dVar60;
  dVar60 = (((((((local_1608[8] - dVar306) - dVar274) - dVar98) - dVar288) - dVar298) - dVar211) -
           dVar60) - dVar106;
  auVar12._8_4_ = SUB84(dVar60,0);
  auVar12._0_8_ = local_1608[7];
  auVar12._12_4_ = (int)((ulong)dVar60 >> 0x20);
  local_1608[8] = auVar12._8_8_;
  local_1608[0xc] = (local_1608[0xc] + dVar278) - dVar106;
  dVar60 = dStack_14f8 * 19371657.71343335;
  dVar211 = dStack_14e8 * 14000000.0;
  local_c30 = dVar60 + dVar60 + ((dVar293 + (local_c30 - dVar142)) - dVar245);
  local_c38 = (((((((((((((local_c38 - dVar68) - dVar154) + dVar142) -
                       local_14b0 * 12265169.958139507) - local_14a8 * 7359101.974883704) - dVar287)
                    - dVar108) - dVar293) - adStack_1550[6] * 30000000.0) - dVar245) - dVar60) -
               local_14f0 * 9000000.0) - dStack_14e8 * 7000000.0) - dVar211;
  dVar108 = dVar211 + dVar108 + dVar287 + (double)local_c28._8_8_;
  local_c28._8_4_ = SUB84(dVar108,0);
  local_c28._0_8_ = (double)local_c28._0_8_ - dVar60;
  local_c28._12_4_ = (int)((ulong)dVar108 >> 0x20);
  local_c18 = local_c18 - dVar211;
  local_c08 = dVar211 + dVar154 + local_c08;
  local_388[7] = dVar195 + ((((((dVar95 + ((local_388[7] - dVar257) - dVar215)) - dVar236) - dVar208
                              ) - dVar44) - dVar229) - dVar279) + dStack_1480 + dVar190 + dVar183 +
                 dVar138;
  local_388[8] = ((((((((((local_1398 - dStack_1480) - dVar190) - dVar244) - dVar209) - dVar159) -
                     dVar195) - dVar222) - dVar220) - dVar183) - dVar138) - dVar80;
  local_388[0xc] = (dVar186 + local_1378) - dVar80;
  dVar60 = local_14d0 * -86596485.19199125;
  adStack_1150[0x19] =
       dVar240 + ((((((((((((adStack_1150[0x19] - dVar217) - dVar67) - dVar112) - dVar63) - dVar71)
                       - dVar131) - dVar156) - dVar284) - dVar290) - dVar218) - dVar231) - dVar113)
                 + dVar82 + dVar237 + dVar60;
  adStack_1150[0x1b] = adStack_1150[0x1b] - (dVar237 + dVar237);
  adStack_1150[0x1a] = dVar121 - dVar60;
  adStack_1150[0x20] = ((adStack_1150[0x20] - dVar71) + dVar131 + dVar218 + dVar231) - dVar60;
  local_1020 = dVar60 + local_1020;
  dVar94 = adStack_1550[4] * dStack_1500 * 1793.8203338395704 +
           adStack_1550[5] * dStack_14d8 * -4.52122891906719e-05;
  dVar237 = adStack_1550[4] * dStack_1500 * 3.5866496754579007 +
            (0.001999447552130754 -
            ((local_1408 + local_1458) - (dStack_1430 + dStack_1460)) * 0.0006666666666666666) *
            -4.52122891906719e-05 * adStack_1550[5] * dStack_14d8;
  local_1608[4] =
       (((((((((((((dVar271 + dVar271 +
                    dVar84 + dVar130 + dVar126 + local_1608[4] + dVar37 + dVar317 + dVar239 +
                             dVar302 + dVar27) - dVar252) - (dVar291 + dVar291)) - dVar93) - dVar116
               ) - dVar285) - dVar224) - dVar233) - dVar144) - dVar235) - dVar227) - dVar31) -
       dVar119) + dVar104 + dVar207 + dVar278 + dStack_2b0 + dVar246 + dVar94;
  dVar108 = dStack_1500 * 1793.8203338395704;
  dVar98 = dStack_1500 * 1703.2356556327686;
  local_fd8 = dVar297 + (local_fd8 - dVar248) + dVar134 + dVar98;
  local_fa0 = ((local_fa0 - dVar100) - dVar98) - dVar108;
  dVar63 = dStack_14d8 * -4.52122891906719e-05;
  local_f20 = (((((dVar197 + local_f20) - dVar135) + dVar178) - dVar282) - dVar295) - dVar63;
  dStack_f18 = dVar282 + (((((((((((((dVar86 + dVar86 +
                                      dVar197 + dVar65 + dStack_f18 + dVar250 + dVar125 + dVar267 +
                                      dVar169 + dVar135 + dVar174) - dVar241) - (dVar315 + dVar315))
                                  - dVar178) - dStack_1360) - local_1698) - dVar140) - dVar158) -
                             dVar96) - dVar188) - dVar180) - dVar319) - dVar97) + dVar181 + dVar189
                         + dVar276 + dVar295 + dVar63;
  local_ef0 = (((((local_ef0 + dVar250 + dVar174) - dVar140) - dVar158) + dVar96) - dVar189) -
              dVar63;
  local_ec8 = dVar63 + ((local_1698 + (local_ec8 - dVar267) + dStack_1360) - dVar319) + dVar181;
  dVar86 = adStack_1550[4] * 1793.8203338395704;
  dStack_ba8 = ((((dStack_ba8 + dVar238 + dVar91) - dVar143) - dVar160) - dVar30) + dVar118 + dVar86
  ;
  adStack_1550[5] = adStack_1550[5] * -4.52122891906719e-05;
  local_838 = ((((local_838 + dVar75) - dVar29) - dVar32) - dVar253) + dVar99 + adStack_1550[5];
  local_388[4] = (((((((((((((dVar40 + dVar40 +
                              dVar26 + dVar249 + dVar167 + local_388[4] + dVar64 + dVar283 + dVar301
                                       + dVar78 + dVar203) - dVar223) - (dVar281 + dVar281)) -
                          dVar204) - dVar215) - dVar273) - dVar95) - dVar117) - dVar316) - dVar161)
                   - dVar147) - dVar242) - dVar182) + dVar236 + dVar15 + dVar186 + dVar208 + dVar244
                 + dVar237;
  dVar63 = dStack_14c0 * -159545083.58041438;
  adStack_1150[2] =
       (((((((((adStack_1150[2] + dVar196 + dVar300 + dVar307 + dVar70 + dVar74) - dVar114) - dVar83
             ) - dVar201) - dVar202) - dVar214) - dVar272) - dVar221) - dVar216) + dVar124 + dVar139
       + dVar157 + dVar146 + dVar310 + dVar286 + dVar312 + dVar110 + dVar153 + dVar63;
  adStack_1150[10] = auVar24._8_8_;
  adStack_1150[10] = adStack_1150[10] - (dVar63 + dVar63);
  adStack_1150[0x12] = dVar63 + adStack_1150[0x12] + dVar216;
  dVar63 = dStack_1500 * 592052.8885504483;
  dVar124 = adStack_1550[4] * 1703.2356556327686;
  dStack_b58 = auVar2._8_8_;
  local_b50 = dVar124 + (local_b50 - dVar91) + dVar118;
  local_bb0 = ((local_bb0 + dVar101) - dVar124) - dVar86;
  local_bc0 = local_2c8 + dVar311 + dVar39 + dVar296 + dVar63;
  dStack_bb8 = ((((dStack_bb8 - dVar129) - dVar238) - dVar219) - dVar232) + dVar124;
  dVar60 = adStack_1550[3] * -86596485.19199125;
  dVar82 = adStack_1550[2] * -159545083.58041438;
  local_798 = local_798 + dVar60;
  local_760 = ((local_760 + dVar165) - dVar102) - dVar60;
  dVar153 = dStack_1500 * dStack_1500 * 721.5278371512255 +
            (0.00243737629223557 -
            ((dStack_1470 + dStack_13f0) - (dStack_1430 + dStack_1430)) * 0.0006666666666666666) *
            -159545083.58041438 * dStack_14c0 * adStack_1550[2];
  dVar121 = adStack_1550[4] * dStack_1500 * 10.970836066652648 +
            (0.006441173322300416 -
            ((dStack_1400 + local_1468) - (dStack_1430 + dStack_1460)) * 0.0006666666666666666) *
            -86596485.19199125 * local_14d0 * adStack_1550[3];
  dVar125 = dVar237 + dVar236 + ((dVar215 + ((local_388[0xe] - dVar213) - dVar136) + dVar273) -
                                dVar242) + dVar80;
  dVar216 = dVar121 + dVar15 + (local_388[0xf] - dVar203);
  auVar13._8_4_ = SUB84(dVar216,0);
  auVar13._0_8_ = dVar125;
  auVar13._12_4_ = (int)((ulong)dVar216 >> 0x20);
  local_388[0xf] = auVar13._8_8_;
  dVar96 = dStack_1500 * dStack_1500 * 296026.4442752242 +
           dStack_14c0 * adStack_1550[2] * -159545083.58041438;
  dVar97 = adStack_1550[4] * dStack_1500 * 1703.2356556327686 +
           local_14d0 * adStack_1550[3] * -86596485.19199125;
  local_1608[1] =
       (((((((((local_1608[1] + dVar126 + dVar155 + dVar309 + dVar314 + dVar320) - dVar84) - dVar85)
            - dVar271) - dVar251) - dVar258) - dVar41) - dVar27) - dVar28) + dVar252 + dVar116 +
       dVar285 + dVar235 + dVar14 + dVar107 + dVar246 + dVar274 + dVar288 + dVar96;
  local_1608[2] =
       ((((((((((((local_1608[2] - dVar126) - dVar130) - dVar155) - dVar309) - dVar314) - dVar37) -
            dVar317) - dVar320) - dVar239) - dVar199) - dVar212) - dVar302) + dVar269 + dVar84 +
       dVar291 + dVar97;
  local_1298 = dVar96 + dVar119 + ((double)local_1580._0_8_ - dVar212) + dVar302 + dVar28;
  local_640 = (local_640 - dVar92) + dVar82;
  local_388[1] = (((((((((local_388[1] + dVar166 + dVar167 + dVar257 + dVar168 + dVar187 + dVar289)
                        - dVar26) - dVar270) - dVar40) - dVar89) - dVar115) - dVar136) - dVar203) -
                 dVar175) + dVar223 + dVar215 + dVar273 + dVar161 + dVar44 + dVar229 + dVar244 +
                 dVar159 + dVar222 + dVar153;
  local_388[2] = ((((((((((((local_388[2] - dVar167) - dVar249) - dVar257) - dVar168) - dVar187) -
                       dVar64) - dVar283) - dVar289) - dVar301) - dVar38) - dVar45) - dVar78) +
                 dVar200 + dVar26 + dVar281 + dVar121;
  local_1288 = (local_388[0x11] - dVar45) + dVar78 + dVar175 + dVar182 + dVar153;
  dVar91 = dStack_1500 * local_14e0 * 26480000.0 + dStack_14f8 * local_14f0 * -0.0002710754168835943
  ;
  dVar65 = dStack_1500 * local_14e0 * 0.0 +
           (0.0 - ((dStack_1420 + local_1428) - (dStack_1430 + dStack_1410)) * 0.0006666666666666666
           ) * -0.0002710754168835943 * dStack_14f8 * local_14f0;
  dVar83 = local_14e0 * 26480000.0;
  local_b70 = local_b70 + dVar83;
  dVar154 = local_14f0 * -0.0002710754168835943;
  local_ac0 = local_ac0 + dVar154;
  dVar216 = dStack_14f8 * -0.0002710754168835943;
  local_a20 = local_a20 - dVar216;
  local_a18 = dVar216 + local_a18;
  dVar67 = dStack_14d8 * 390998.5057150522;
  dStack_b58 = (dVar86 + dStack_b58) - dVar67;
  local_b60 = ((local_b60 + dVar219) - dVar83) + dVar67;
  dVar68 = local_14e0 * -2156.4740241498666;
  local_ab0 = (local_ab0 - dVar154) + dVar68;
  local_aa8 = local_aa8 - dVar68;
  dVar70 = dStack_1500 * 26480000.0;
  dVar71 = dStack_14f8 * -2156.4740241498666;
  dVar74 = dStack_14d8 * dStack_1500 * 390998.5057150522 +
           dStack_14f8 * local_14e0 * -2156.4740241498666;
  dVar138 = dStack_14d8 * dStack_1500 * 1244.9131168262245 +
            (0.003183933182940293 -
            ((local_1428 + dStack_1410) - (dStack_1430 + local_1408)) * 0.0006666666666666666) *
            -2156.4740241498666 * dStack_14f8 * local_14e0;
  local_8c0 = ((local_8c0 + dVar76) - dVar70) - dVar71;
  local_8b8 = dVar71 + local_8b8 + dVar70;
  local_898 = ((((local_898 - dVar133) - dVar164) - dVar303) - dVar42) - dVar71;
  dStack_1350 = dStack_14f8;
  dVar141 = dStack_1500 * 390998.5057150522;
  local_810 = (((local_810 - dVar163) + dVar59) - adStack_1550[5]) - dVar141;
  local_808 = local_808 + dVar141;
  local_7f0 = local_7f0 + dVar75 + dVar81 + dVar90 + dVar253 + dVar141;
  local_13c8 = dStack_b40 + dVar63;
  local_1368 = local_b38;
  dVar245 = dStack_14f8 * -5603.460820379699;
  local_600 = ((local_600 + dVar61) - (dVar82 + dVar82)) - dVar245;
  local_5f8 = local_5f8 + dVar245;
  local_5b8 = (((local_5b8 - dVar268) - dVar92) - dVar206) - dVar245;
  dVar211 = adStack_1550[4] * 1923289.8439964922;
  local_1258 = adStack_1550[4];
  uStack_1250 = 0;
  dVar110 = dStack_1500 * 61950.158398051455;
  local_550 = local_550 - dVar110;
  local_548 = local_548 + dVar110;
  local_510 = local_510 + dVar62 + dVar137 + dVar148 + dVar110;
  local_508 = (((local_508 - dVar62) - dVar137) - dVar148) - dVar110;
  dVar62 = adStack_1550[7] * -132.4388903689313;
  local_a50 = (((local_a50 - dVar79) - dVar308) - dVar305) - dVar62;
  local_a38 = (local_a38 - dVar105) + dVar62;
  dStack_a10 = dVar216 + dVar305 + dVar308 + ((dVar234 +
                                              ((((dStack_a10 + dVar72) - dVar79) + dVar173) -
                                              dVar226)) - dVar105) + dVar313 + dVar62;
  dStack_a00 = ((((dStack_a00 - dVar72) - dVar173) - dVar234) - dVar216) - dVar62;
  dVar62 = adStack_1550[4] * 6645614.320408218;
  local_8f0 = ((local_8f0 - dVar164) - dVar254) - dVar62;
  local_8d8 = local_8d8 + dVar164 + dVar62;
  dStack_8b0 = dVar70 + dStack_8b0 + dVar73 + dVar318 + dVar145 + dVar62;
  local_8a0 = (((dVar254 +
                (((((((dVar69 + dVar128 + local_8a0) - dVar73) - dVar73) + dVar133 + dVar76 +
                   dVar164) - dVar318) + dVar303) - dVar145) + dVar42) - dVar70) + dVar71) - dVar62;
  dVar216 = adStack_1550[4] * local_14e0 * 594.5215787626531 +
            (8.946074058750579e-05 -
            ((dStack_1420 + local_1448) - (dStack_1410 + dStack_1460)) * 0.0006666666666666666) *
            -132.4388903689313 * adStack_1550[7] * local_14f0;
  dVar308 = local_14d0 * adStack_1550[4] * 8226.248452056829 +
            (0.0042771756309819275 -
            ((local_1408 + local_1448) - (dStack_1400 + dStack_1460)) * 0.0006666666666666666) *
            -43.301595906050935 * dStack_14d8 * adStack_1550[7];
  dVar62 = local_14e0 * 6645614.320408218;
  dVar164 = local_14d0 * 1923289.8439964922;
  local_f90 = dVar256 + dVar120 + (local_f90 - dVar134) + dVar62;
  local_f80 = (dVar184 + local_f80 + dVar122) - dVar62;
  dStack_f78 = dVar164 + (dStack_f78 - dVar122) + dVar108;
  local_1228 = (((((dStack_fb8 - dVar248) + dVar122) - dVar292) - dVar247) - dVar100) + dVar62 +
               dVar164;
  dStack_f70 = (dStack_f70 + dVar98) - dVar164;
  dVar247 = local_14f0 * -132.4388903689313;
  dVar110 = dStack_14d8 * -43.301595906050935;
  local_d80 = (local_d80 - dVar16) + dVar247;
  local_d70 = (local_d70 + dVar170) - dVar247;
  dStack_d68 = dVar110 + dVar162 + (dStack_d68 - dVar170);
  dStack_d60 = (dVar275 + dStack_d60) - dVar110;
  dVar122 = adStack_1550[7] * -43.301595906050935;
  local_840 = ((local_840 - dVar81) - adStack_1550[5]) - dVar122;
  local_828 = ((local_828 + dVar81) - dVar99) + dVar122;
  local_7e8 = ((adStack_1550[5] +
               dVar132 + dVar99 + ((dVar32 + (((((dVar163 + local_7e8) - dVar75) + dVar59) - dVar81)
                                             - dVar90) + dVar29) - dVar253)) - dVar141) + dVar122;
  local_7e0 = local_7e0 - dVar122;
  local_790 = (local_790 - dVar60) - dVar211;
  local_778 = (local_778 - dVar102) + dVar211;
  local_738 = local_738 + dVar211;
  local_730 = (dVar60 + dVar102 + (local_730 - dVar165)) - dVar211;
  local_388[0xb] =
       dVar209 + dVar244 + ((((dVar115 + ((local_388[0xb] + dVar166 + dVar283) - dVar200)) - dVar161
                             ) + dVar147) - dVar186) + dVar80 + dVar65 + dVar216;
  dVar60 = adStack_1550[4] * local_14e0 * 6645614.320408218 +
           adStack_1550[7] * local_14f0 * -132.4388903689313;
  dVar59 = local_14d0 * adStack_1550[4] * 1923289.8439964922 +
           dStack_14d8 * adStack_1550[7] * -43.301595906050935;
  local_1608[0xb] = dVar306 + (dVar43 - dVar278) + dVar246 + dVar106 + dVar91 + dVar60;
  local_1608[0xd] = ((dStack_1280 - dVar91) + dVar74) - dVar60;
  local_1608[0xe] =
       dVar59 + ((dVar94 + dVar106 + ((dVar285 +
                                      (((dVar212 + ((dVar314 + local_1608[0xe]) - dVar239)) -
                                       dVar280) - dVar41) + dVar116) - dVar31) + dVar104) - dVar74);
  local_1608[0xf] = (dVar97 + dVar207 + (local_1608[0xf] - dVar27)) - dVar59;
  local_388[0xd] = (((dVar208 + dStack_1370) - dVar65) + dVar138) - dVar216;
  local_388[0xe] = dVar308 + (dVar125 - dVar138);
  local_388[0xf] = local_388[0xf] - dVar308;
  dVar166 = adStack_1550[7] * -5461.432196104055;
  local_1358 = local_d50;
  local_6e0 = local_6e0 - dVar166;
  local_6c8 = local_6c8 + dVar166;
  local_678 = dVar294 + dVar151 + (local_678 - dVar77) + dVar166;
  local_670 = local_670 - dVar166;
  dVar125 = adStack_1550[4] * 228932.11193603993;
  local_630 = local_630 - dVar125;
  dVar166 = local_14b8 * 61950.158398051455;
  local_b80 = ((((((dVar277 + dVar277 +
                   ((dVar39 + dVar152 + dVar152 + (local_1270 - dVar311)) - dVar296)) - dVar124) -
                 dVar86) - (dVar63 + dVar63)) - dVar83) - dVar67) - dVar166;
  local_b78 = ((((((local_b78 - dVar238) - dVar87) - dVar30) + dVar101) - dVar152) - dVar277) +
              dVar83 + dVar67 + dVar166;
  dStack_b40 = dStack_b40 + dVar63 + dVar166;
  local_b48 = dVar296 + (local_b48 - dVar219) + dVar311;
  local_b38 = local_b38 - dVar166;
  dVar166 = dStack_14c0 * -5603.460820379699;
  local_ad0 = (((dVar225 + dVar225 +
                dVar230 + dVar230 + ((local_ad0 + dVar198 + dVar88 + dVar179) - dVar103)) - dVar154)
              - dVar68) - dVar166;
  local_ac8 = (local_1210 - dVar225) + dVar154 + dVar68 + dVar166;
  local_a90 = local_a90 + dVar166;
  local_a88 = local_a88 - dVar166;
  dVar63 = adStack_1550[4] * dStack_14c0 * 198.4042264437053 +
           (0.0008666509244414622 -
           ((local_1448 + local_13f8) - (dStack_13f0 + dStack_1460)) * 0.0006666666666666666) *
           -5461.432196104055 * adStack_1550[7] * local_14c8;
  dVar163 = dStack_1500 * local_14b8 * 216.6497304178424 +
            (0.0034971618478485886 -
            ((local_1428 + dStack_13f0) - (local_13e8 + dStack_1430)) * 0.0006666666666666666) *
            -5603.460820379699 * dStack_14f8 * dStack_14c0;
  local_388[9] = ((((((dVar220 + dVar220 +
                      ((dVar159 +
                       dVar279 + dVar279 +
                       ((dVar44 + (((((((local_388[9] - dVar187) + dVar64 + dVar38 + dVar45 + dVar89
                                       + dVar203) - dVar95) - dVar117) + dVar316) - dVar228) -
                                  dVar15)) - dVar229)) - dVar222)) - dVar121) - dVar237) -
                   (dVar153 + dVar153)) - dVar65) - dVar138) - dVar163;
  local_388[10] = ((local_1208 - dVar279) - dVar220) + dVar65 + dVar138 + dVar163;
  dVar64 = adStack_1550[4] * dStack_14c0 * 228932.11193603993 +
           adStack_1550[7] * local_14c8 * -5461.432196104055;
  dVar122 = dStack_1500 * local_14b8 * 61950.158398051455 +
            dStack_14f8 * dStack_14c0 * -5603.460820379699;
  local_1608[9] =
       ((((((dVar298 + dVar298 +
            ((dVar274 +
             dVar109 + dVar109 +
             (((((((((local_1608[9] - dVar314) + dVar37 + dVar199 + dVar212 + dVar251 + dVar27) -
                   dVar224) - dVar233) + dVar144) - dStack_13a0) - dVar207) + dVar14) - dVar107)) -
            dVar288)) - dVar97) - dVar94) - (dVar96 + dVar96)) - dVar91) - dVar74) - dVar122;
  local_1608[10] =
       ((((((local_1608[10] - dVar37) - dVar251) - dVar144) + dStack_13a0) - dVar109) - dVar298) +
       dVar91 + dVar74 + dVar122;
  local_1608[3] =
       ((((((((((((dVar130 + local_1608[3]) - dVar269) - dVar280) - dVar84) + dVar85 + dVar93 +
              dStack_13a0) - dStack_2b0) - dVar246) - dVar306) - dVar97) - dVar94) - dVar60) -
       dVar59) - dVar64;
  local_1608[6] = ((dVar25 - dVar207) - dVar278) + dVar60 + dVar59 + dVar64;
  local_1608[0x10] = dVar288 + dVar107 + (local_1608[0x10] - dVar199) + dVar64;
  dVar166 = (((dVar123 - dVar302) - dVar28) - dVar119) - dVar122;
  local_1580._8_4_ = SUB84(dVar166,0);
  local_1580._0_8_ = (dVar122 + local_1298) - dVar64;
  local_1580._12_4_ = (int)((ulong)dVar166 >> 0x20);
  dStack_14c0 = dStack_14c0 * 228932.11193603993;
  dStack_fc8 = dStack_fc8 + dVar184 + dVar120 + dVar108;
  dStack_fd0 = ((((((((dVar299 + dVar100) - dVar184) - dVar120) - dVar256) - dVar98) - dVar108) -
                dVar62) - dVar164) - dStack_14c0;
  dStack_fb8 = local_1228 + dStack_14c0;
  local_f68 = local_f68 + dStack_14c0;
  local_f60 = local_f60 - dStack_14c0;
  local_14c8 = local_14c8 * -5461.432196104055;
  dStack_db8 = dStack_db8 + dVar162 + dVar275 + dVar16;
  local_dc0 = (((dVar177 + dVar149) - dVar247) - dVar110) - local_14c8;
  dStack_da8 = (((((((((dStack_da8 - dVar66) + dVar170) - dVar171) - dVar172) - dVar176) - dVar162)
                 - dVar149) - dVar275) - dVar16) + dVar247 + dVar110 + local_14c8;
  local_d58 = local_d58 + local_14c8;
  local_d50 = local_d50 - local_14c8;
  local_618 = local_618 + dVar125;
  local_5c8 = local_5c8 + dVar125;
  local_5c0 = ((local_5c0 - dVar61) + dVar268 + dVar92 + dVar206 + dVar82 + dVar245) - dVar125;
  local_388[3] = ((((((((((((dVar249 + local_388[3]) - dVar200) - dVar213) - dVar26) + dVar270 +
                         dVar204 + dVar228) - dVar208) - dVar244) - dVar209) - dVar121) - dVar237) -
                  dVar216) - dVar308) - dVar63;
  local_388[6] = (((((((((local_388[6] - dVar249) + dVar213) - dVar270) - dVar40) - dVar204) -
                    dVar236) - dVar228) - dVar15) - dVar186) + dVar216 + dVar308 + dVar63;
  local_388[0x10] = dVar222 + dVar229 + (local_388[0x10] - dVar38) + dVar63;
  local_388[0x11] = (dVar163 + local_1288) - dVar63;
  local_388[0x12] = (((local_388[0x12] - dVar78) - dVar175) - dVar182) - dVar163;
  if (local_11fc == 0) {
    local_268[0] = 2.8822959451999997;
    local_268[1] = 1.4999999982659773;
    local_268[2] = 1.507252090419375;
    local_268[3] = 3.398993884662499;
    local_268[4] = 2.9627907471999997;
    local_268[5] = 4.687841430575;
    local_268[6] = 5.2821630604062495;
    local_268[7] = 4.97163097458125;
    local_268[8] = 4.98750050771875;
    local_268[9] = 7.198434206537501;
    local_268[10] = 9.874274296874997;
    local_268[0xb] = 3.2349510160250006;
    local_268[0xc] = 6.023470866475001;
    local_268[0xd] = 5.33591319330625;
    local_268[0xe] = 7.5590570047500005;
    local_268[0xf] = 9.825474777499998;
    local_268[0x10] = 12.2373674399375;
    local_268[0x11] = 14.246951215250002;
    local_268[0x12] = 16.552933378125;
    local_268[0x13] = 3.1861203930625;
    local_268[0x14] = 1.5;
    local_1b8[0] = 0.000507239459;
    local_1b8[1] = 1.4767295125000317e-13;
    local_1b8[2] = -1.116620304e-05;
    local_1b8[3] = 0.00033054475434999984;
    local_1b8[4] = 0.0004928155568499999;
    local_1b8[5] = 0.0012567384129500002;
    local_1b8[6] = 0.0009643321552500001;
    local_1b8[7] = 0.0009323347502999997;
    local_1b8[8] = 0.0009823763672500007;
    local_1b8[9] = 0.0016686828392500003;
    local_1b8[10] = 0.0030726129075;
    local_1b8[0xb] = 0.00034398350740000034;
    local_1b8[0xc] = 0.0006661732772499996;
    local_1b8[0xd] = 0.0007601921039999995;
    local_1b8[0xe] = 0.0015323131260000008;
    local_1b8[0xf] = 0.0022796327649999997;
    local_1b8[0x10] = 0.0027535931289999994;
    local_1b8[0x11] = 0.0032581048315000038;
    local_1b8[0x12] = 0.0039887186525;
    local_1b8[0x13] = 0.00037292862650000006;
    local_1b8[0x14] = 0.0;
    local_d8 = 1.9101473600491665;
    dVar165 = 2.079423123570834;
    dVar216 = 1.0030833333333333;
    dVar163 = 17.914627724425;
    dVar60 = 2.874817692333335;
    dVar64 = 7.078776559375;
    dVar125 = 11.395261584404166;
    uVar191 = 0x3b81a1b0;
    uVar192 = 0x401afa1c;
    uVar193 = 0x2ff0e67f;
    uVar194 = 0xc010e896;
    dVar59 = -6.748131844745;
    dVar61 = -27.605086887896665;
    dVar62 = 16.114317783399166;
    dVar123 = -0.5650564362916671;
    dVar122 = 34.602608086557915;
    dVar164 = 37.543891960460414;
    dVar166 = -16.524086927680834;
    dVar63 = 4.3818731557687505;
    uVar259 = 0x919c8014;
    uVar260 = 0x40020b57;
    uVar261 = 0xd3fd44c6;
    uVar262 = 0x40146fd4;
    uVar263 = 0x2efd9734;
    uVar264 = 0x40327b81;
    uVar265 = 0xaf13a7dd;
    uVar266 = 0x403501f0;
    pdVar47 = local_d0;
    pdVar50 = local_c0;
    pdVar51 = local_b0;
    pdVar55 = local_a0;
    pdVar56 = local_90;
    pdVar57 = local_80;
    pdVar58 = local_70;
    pdVar53 = local_60;
    local_278 = local_290;
    local_280 = local_298;
  }
  else {
    local_268[0] = 3.8822959451999997;
    local_268[1] = 2.4999999982659773;
    local_268[2] = 2.507252090419375;
    local_268[3] = 4.398993884662499;
    local_268[4] = 3.9627907472;
    local_268[5] = 5.687841430575;
    local_268[6] = 6.28216306040625;
    local_268[7] = 5.971630974581251;
    local_268[8] = 5.98750050771875;
    local_268[9] = 8.1984342065375;
    local_268[10] = 10.874274296874997;
    local_268[0xb] = 4.234951016024999;
    local_268[0xc] = 7.023470866475001;
    local_268[0xd] = 6.33591319330625;
    local_268[0xe] = 8.55905700475;
    local_268[0xf] = 10.825474777499998;
    local_268[0x10] = 13.237367439937499;
    local_268[0x11] = 15.24695121525;
    local_268[0x12] = 17.552933378125;
    local_268[0x13] = 4.1861203930625;
    local_268[0x14] = 2.5;
    local_1b8[0] = 0.000507239459;
    dVar165 = 0.00037292862650000006;
    dVar216 = 0.0;
    dVar163 = 0.0032581048315000038;
    dVar60 = 0.0039887186525;
    dVar64 = 0.0022796327649999997;
    dVar125 = 0.0027535931289999994;
    uVar191 = 0x1cd88321;
    uVar192 = 0x3f48e8f4;
    uVar193 = 0xb0db9218;
    uVar194 = 0x3f591afc;
    dVar59 = 0.00034398350740000034;
    dVar61 = 0.0006661732772499996;
    dVar62 = 0.0016686828392500003;
    dVar123 = 0.0030726129075;
    dVar122 = 0.0009323347502999997;
    dVar164 = 0.0009823763672500007;
    dVar166 = 0.0012567384129500002;
    dVar63 = 0.0009643321552500001;
    uVar259 = 0xe8e87ee7;
    uVar260 = 0x3f35a99e;
    uVar261 = 0x598d8058;
    uVar262 = 0x3f402609;
    uVar263 = 0x91b4691f;
    uVar264 = 0x3d44c87a;
    uVar265 = 0x42942cb3;
    uVar266 = 0xbee76acf;
    pdVar48 = &local_1478;
    pdVar47 = local_1b8 + 1;
    pdVar50 = local_1b8 + 3;
  }
  *(undefined4 *)pdVar47 = uVar263;
  *(undefined4 *)((long)pdVar47 + 4) = uVar264;
  *(undefined4 *)(pdVar47 + 1) = uVar265;
  *(undefined4 *)((long)pdVar47 + 0xc) = uVar266;
  *(undefined4 *)pdVar50 = uVar259;
  *(undefined4 *)((long)pdVar50 + 4) = uVar260;
  *(undefined4 *)(pdVar50 + 1) = uVar261;
  *(undefined4 *)((long)pdVar50 + 0xc) = uVar262;
  *pdVar51 = dVar166;
  pdVar51[1] = dVar63;
  *pdVar55 = dVar122;
  pdVar55[1] = dVar164;
  *pdVar56 = dVar62;
  pdVar56[1] = dVar123;
  *pdVar57 = dVar59;
  pdVar57[1] = dVar61;
  *(undefined4 *)pdVar58 = uVar191;
  *(undefined4 *)((long)pdVar58 + 4) = uVar192;
  *(undefined4 *)(pdVar58 + 1) = uVar193;
  *(undefined4 *)((long)pdVar58 + 0xc) = uVar194;
  *pdVar53 = dVar64;
  pdVar53[1] = dVar125;
  *local_278 = dVar163;
  local_278[1] = dVar60;
  *local_280 = dVar165;
  local_280[1] = dVar216;
  dVar63 = 0.0;
  dVar163 = 0.0;
  dVar166 = 0.0;
  lVar46 = 0;
  dVar60 = 0.0;
  do {
    dVar64 = *(double *)((long)adStack_1550 + lVar46 + 8U);
    dVar60 = dVar60 + *(double *)((long)local_268 + lVar46) * dVar64;
    dVar125 = *(double *)((long)pdVar48 + lVar46);
    dVar63 = dVar63 + dVar64 * *(double *)((long)local_1b8 + lVar46);
    dVar163 = dVar163 + *(double *)((long)local_1608 + lVar46) * dVar125;
    dVar166 = dVar166 + (*(double *)((long)local_268 + lVar46) - dVar125) * 0.0006666666666666666 *
                        *(double *)((long)local_1608 + lVar46) +
                        dVar125 * *(double *)((long)local_388 + lVar46);
    lVar46 = lVar46 + 8;
  } while (lVar46 != 0xa8);
  dVar163 = dVar163 * (1.0 / dVar60);
  dVar64 = (1.0 / dVar60) * 1500.0;
  dVar60 = dVar163 * dVar64;
  dVar64 = -dVar64;
  lVar46 = 0;
  do {
    dVar125 = 0.0;
    lVar52 = 0;
    do {
      dVar125 = dVar125 + pdVar48[lVar52] * __s[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x15);
    adStack_1150[lVar46 * 0x16] = local_268[lVar46] * dVar60 + dVar125 * dVar64;
    lVar46 = lVar46 + 1;
    __s = __s + 0x16;
  } while (lVar46 != 0x15);
  pdVar48 = &local_11f8;
  local_2e0 = dVar64 * dVar166 + (dVar60 * dVar63 - dVar163);
  *local_270 = 0;
  iVar49 = 0;
  lVar46 = 0;
  iVar54 = 0;
  do {
    lVar52 = 0;
    do {
      if (lVar46 == lVar52) {
        rowVals[iVar54] = (int)lVar46;
        indx[iVar54] = (int)lVar46 * 0x17;
LAB_00192aff:
        iVar54 = iVar54 + 1;
      }
      else if ((pdVar48[lVar52] != 0.0) || (NAN(pdVar48[lVar52]))) {
        rowVals[iVar54] = (int)lVar52;
        indx[iVar54] = iVar49 + (int)lVar52;
        goto LAB_00192aff;
      }
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x16);
    local_270[lVar46 + 1] = iVar54;
    lVar46 = lVar46 + 1;
    pdVar48 = pdVar48 + 0x16;
    iVar49 = iVar49 + 0x16;
    if (lVar46 == 0x16) {
      return;
    }
  } while( true );
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(
  int* rowVals, int* colPtrs, int* indx, const int* consP)
{
  amrex::GpuArray<amrex::Real, 484> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 21> conc = {0.0};
  for (int n = 0; n < 21; n++) {
    conc[n] = 1.0 / 21.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  colPtrs[0] = 0;
  int nJdata_tmp = 0;
  for (int k = 0; k < 22; k++) {
    for (int l = 0; l < 22; l++) {
      if (k == l) {
        rowVals[nJdata_tmp] = l;
        indx[nJdata_tmp] = 22 * k + l;
        nJdata_tmp = nJdata_tmp + 1;
      } else {
        if (Jac[22 * k + l] != 0.0) {
          rowVals[nJdata_tmp] = l;
          indx[nJdata_tmp] = 22 * k + l;
          nJdata_tmp = nJdata_tmp + 1;
        }
      }
    }
    colPtrs[k + 1] = nJdata_tmp;
  }
}